

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  byte bVar104;
  byte bVar105;
  ulong uVar106;
  uint uVar107;
  uint uVar108;
  ulong uVar109;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  uint uVar110;
  Geometry *pGVar111;
  uint uVar112;
  ulong uVar113;
  long lVar114;
  byte bVar115;
  float fVar116;
  float fVar117;
  float fVar166;
  float fVar167;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar121 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar122 [16];
  float fVar168;
  float fVar170;
  float fVar171;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar169;
  float fVar172;
  float fVar173;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar174;
  undefined4 uVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined8 uVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar194;
  float fVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  undefined1 auVar203 [64];
  float fVar205;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_910;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  Geometry *local_8d0;
  undefined1 (*local_8c8) [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined8 uStack_7f8;
  LinearSpace3fa *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  float local_740;
  undefined1 auStack_73c [8];
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar12 = prim[1];
  uVar109 = (ulong)(byte)PVar12;
  fVar205 = *(float *)(prim + uVar109 * 0x19 + 0x12);
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar120 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar189 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar196 = vsubps_avx(auVar31,*(undefined1 (*) [16])(prim + uVar109 * 0x19 + 6));
  fVar194 = fVar205 * auVar196._0_4_;
  fVar174 = fVar205 * auVar189._0_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar109 * 4 + 6);
  auVar128 = vpmovsxbd_avx2(auVar31);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar109 * 5 + 6);
  auVar126 = vpmovsxbd_avx2(auVar120);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar109 * 6 + 6);
  auVar141 = vpmovsxbd_avx2(auVar119);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar109 * 0xb + 6);
  auVar142 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar139 = vpmovsxbd_avx2(auVar9);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar140 = vcvtdq2ps_avx(auVar139);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar109 + 6);
  auVar127 = vpmovsxbd_avx2(auVar238);
  auVar127 = vcvtdq2ps_avx(auVar127);
  uVar113 = (ulong)(uint)((int)(uVar109 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar113 + 6);
  auVar129 = vpmovsxbd_avx2(auVar10);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar113 + uVar109 + 6);
  auVar130 = vpmovsxbd_avx2(auVar118);
  auVar130 = vcvtdq2ps_avx(auVar130);
  uVar106 = (ulong)(uint)((int)(uVar109 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar125 = vpmovsxbd_avx2(auVar11);
  auVar131 = vcvtdq2ps_avx(auVar125);
  auVar229._4_4_ = fVar174;
  auVar229._0_4_ = fVar174;
  auVar229._8_4_ = fVar174;
  auVar229._12_4_ = fVar174;
  auVar229._16_4_ = fVar174;
  auVar229._20_4_ = fVar174;
  auVar229._24_4_ = fVar174;
  auVar229._28_4_ = fVar174;
  auVar231._8_4_ = 1;
  auVar231._0_8_ = 0x100000001;
  auVar231._12_4_ = 1;
  auVar231._16_4_ = 1;
  auVar231._20_4_ = 1;
  auVar231._24_4_ = 1;
  auVar231._28_4_ = 1;
  auVar123 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar133 = ZEXT1632(CONCAT412(fVar205 * auVar189._12_4_,
                                CONCAT48(fVar205 * auVar189._8_4_,
                                         CONCAT44(fVar205 * auVar189._4_4_,fVar174))));
  auVar132 = vpermps_avx2(auVar231,auVar133);
  auVar124 = vpermps_avx512vl(auVar123,auVar133);
  fVar174 = auVar124._0_4_;
  fVar211 = auVar124._4_4_;
  auVar133._4_4_ = fVar211 * auVar141._4_4_;
  auVar133._0_4_ = fVar174 * auVar141._0_4_;
  fVar212 = auVar124._8_4_;
  auVar133._8_4_ = fVar212 * auVar141._8_4_;
  fVar195 = auVar124._12_4_;
  auVar133._12_4_ = fVar195 * auVar141._12_4_;
  fVar204 = auVar124._16_4_;
  auVar133._16_4_ = fVar204 * auVar141._16_4_;
  fVar116 = auVar124._20_4_;
  auVar133._20_4_ = fVar116 * auVar141._20_4_;
  fVar117 = auVar124._24_4_;
  auVar133._24_4_ = fVar117 * auVar141._24_4_;
  auVar133._28_4_ = auVar139._28_4_;
  auVar139._4_4_ = auVar127._4_4_ * fVar211;
  auVar139._0_4_ = auVar127._0_4_ * fVar174;
  auVar139._8_4_ = auVar127._8_4_ * fVar212;
  auVar139._12_4_ = auVar127._12_4_ * fVar195;
  auVar139._16_4_ = auVar127._16_4_ * fVar204;
  auVar139._20_4_ = auVar127._20_4_ * fVar116;
  auVar139._24_4_ = auVar127._24_4_ * fVar117;
  auVar139._28_4_ = auVar125._28_4_;
  auVar125._4_4_ = auVar131._4_4_ * fVar211;
  auVar125._0_4_ = auVar131._0_4_ * fVar174;
  auVar125._8_4_ = auVar131._8_4_ * fVar212;
  auVar125._12_4_ = auVar131._12_4_ * fVar195;
  auVar125._16_4_ = auVar131._16_4_ * fVar204;
  auVar125._20_4_ = auVar131._20_4_ * fVar116;
  auVar125._24_4_ = auVar131._24_4_ * fVar117;
  auVar125._28_4_ = auVar124._28_4_;
  auVar31 = vfmadd231ps_fma(auVar133,auVar132,auVar126);
  auVar120 = vfmadd231ps_fma(auVar139,auVar132,auVar140);
  auVar119 = vfmadd231ps_fma(auVar125,auVar130,auVar132);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar229,auVar128);
  auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar229,auVar142);
  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar129,auVar229);
  auVar230._4_4_ = fVar194;
  auVar230._0_4_ = fVar194;
  auVar230._8_4_ = fVar194;
  auVar230._12_4_ = fVar194;
  auVar230._16_4_ = fVar194;
  auVar230._20_4_ = fVar194;
  auVar230._24_4_ = fVar194;
  auVar230._28_4_ = fVar194;
  auVar125 = ZEXT1632(CONCAT412(fVar205 * auVar196._12_4_,
                                CONCAT48(fVar205 * auVar196._8_4_,
                                         CONCAT44(fVar205 * auVar196._4_4_,fVar194))));
  auVar139 = vpermps_avx2(auVar231,auVar125);
  auVar125 = vpermps_avx512vl(auVar123,auVar125);
  fVar205 = auVar125._0_4_;
  fVar174 = auVar125._4_4_;
  auVar132._4_4_ = fVar174 * auVar141._4_4_;
  auVar132._0_4_ = fVar205 * auVar141._0_4_;
  fVar211 = auVar125._8_4_;
  auVar132._8_4_ = fVar211 * auVar141._8_4_;
  fVar212 = auVar125._12_4_;
  auVar132._12_4_ = fVar212 * auVar141._12_4_;
  fVar195 = auVar125._16_4_;
  auVar132._16_4_ = fVar195 * auVar141._16_4_;
  fVar204 = auVar125._20_4_;
  auVar132._20_4_ = fVar204 * auVar141._20_4_;
  fVar116 = auVar125._24_4_;
  auVar132._24_4_ = fVar116 * auVar141._24_4_;
  auVar132._28_4_ = 1;
  auVar123._4_4_ = auVar127._4_4_ * fVar174;
  auVar123._0_4_ = auVar127._0_4_ * fVar205;
  auVar123._8_4_ = auVar127._8_4_ * fVar211;
  auVar123._12_4_ = auVar127._12_4_ * fVar212;
  auVar123._16_4_ = auVar127._16_4_ * fVar195;
  auVar123._20_4_ = auVar127._20_4_ * fVar204;
  auVar123._24_4_ = auVar127._24_4_ * fVar116;
  auVar123._28_4_ = auVar141._28_4_;
  auVar127._4_4_ = auVar131._4_4_ * fVar174;
  auVar127._0_4_ = auVar131._0_4_ * fVar205;
  auVar127._8_4_ = auVar131._8_4_ * fVar211;
  auVar127._12_4_ = auVar131._12_4_ * fVar212;
  auVar127._16_4_ = auVar131._16_4_ * fVar195;
  auVar127._20_4_ = auVar131._20_4_ * fVar204;
  auVar127._24_4_ = auVar131._24_4_ * fVar116;
  auVar127._28_4_ = auVar125._28_4_;
  auVar8 = vfmadd231ps_fma(auVar132,auVar139,auVar126);
  auVar9 = vfmadd231ps_fma(auVar123,auVar139,auVar140);
  auVar238 = vfmadd231ps_fma(auVar127,auVar139,auVar130);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar230,auVar128);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar230,auVar142);
  auVar222._8_4_ = 0x7fffffff;
  auVar222._0_8_ = 0x7fffffff7fffffff;
  auVar222._12_4_ = 0x7fffffff;
  auVar222._16_4_ = 0x7fffffff;
  auVar222._20_4_ = 0x7fffffff;
  auVar222._24_4_ = 0x7fffffff;
  auVar222._28_4_ = 0x7fffffff;
  auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),auVar230,auVar129);
  auVar128 = vandps_avx(ZEXT1632(auVar31),auVar222);
  auVar138._8_4_ = 0x219392ef;
  auVar138._0_8_ = 0x219392ef219392ef;
  auVar138._12_4_ = 0x219392ef;
  auVar138._16_4_ = 0x219392ef;
  auVar138._20_4_ = 0x219392ef;
  auVar138._24_4_ = 0x219392ef;
  auVar138._28_4_ = 0x219392ef;
  uVar113 = vcmpps_avx512vl(auVar128,auVar138,1);
  bVar17 = (bool)((byte)uVar113 & 1);
  auVar124._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._0_4_;
  bVar17 = (bool)((byte)(uVar113 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._4_4_;
  bVar17 = (bool)((byte)(uVar113 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._8_4_;
  bVar17 = (bool)((byte)(uVar113 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._12_4_;
  auVar124._16_4_ = (uint)((byte)(uVar113 >> 4) & 1) * 0x219392ef;
  auVar124._20_4_ = (uint)((byte)(uVar113 >> 5) & 1) * 0x219392ef;
  auVar124._24_4_ = (uint)((byte)(uVar113 >> 6) & 1) * 0x219392ef;
  auVar124._28_4_ = (uint)(byte)(uVar113 >> 7) * 0x219392ef;
  auVar128 = vandps_avx(ZEXT1632(auVar120),auVar222);
  uVar113 = vcmpps_avx512vl(auVar128,auVar138,1);
  bVar17 = (bool)((byte)uVar113 & 1);
  auVar134._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar120._0_4_;
  bVar17 = (bool)((byte)(uVar113 >> 1) & 1);
  auVar134._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar120._4_4_;
  bVar17 = (bool)((byte)(uVar113 >> 2) & 1);
  auVar134._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar120._8_4_;
  bVar17 = (bool)((byte)(uVar113 >> 3) & 1);
  auVar134._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar120._12_4_;
  auVar134._16_4_ = (uint)((byte)(uVar113 >> 4) & 1) * 0x219392ef;
  auVar134._20_4_ = (uint)((byte)(uVar113 >> 5) & 1) * 0x219392ef;
  auVar134._24_4_ = (uint)((byte)(uVar113 >> 6) & 1) * 0x219392ef;
  auVar134._28_4_ = (uint)(byte)(uVar113 >> 7) * 0x219392ef;
  auVar128 = vandps_avx(ZEXT1632(auVar119),auVar222);
  uVar113 = vcmpps_avx512vl(auVar128,auVar138,1);
  bVar17 = (bool)((byte)uVar113 & 1);
  auVar128._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar119._0_4_;
  bVar17 = (bool)((byte)(uVar113 >> 1) & 1);
  auVar128._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar119._4_4_;
  bVar17 = (bool)((byte)(uVar113 >> 2) & 1);
  auVar128._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar119._8_4_;
  bVar17 = (bool)((byte)(uVar113 >> 3) & 1);
  auVar128._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar119._12_4_;
  auVar128._16_4_ = (uint)((byte)(uVar113 >> 4) & 1) * 0x219392ef;
  auVar128._20_4_ = (uint)((byte)(uVar113 >> 5) & 1) * 0x219392ef;
  auVar128._24_4_ = (uint)((byte)(uVar113 >> 6) & 1) * 0x219392ef;
  auVar128._28_4_ = (uint)(byte)(uVar113 >> 7) * 0x219392ef;
  auVar126 = vrcp14ps_avx512vl(auVar124);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar219._16_4_ = 0x3f800000;
  auVar219._20_4_ = 0x3f800000;
  auVar219._24_4_ = 0x3f800000;
  auVar219._28_4_ = 0x3f800000;
  auVar31 = vfnmadd213ps_fma(auVar124,auVar126,auVar219);
  auVar31 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar126,auVar126);
  auVar126 = vrcp14ps_avx512vl(auVar134);
  auVar120 = vfnmadd213ps_fma(auVar134,auVar126,auVar219);
  auVar120 = vfmadd132ps_fma(ZEXT1632(auVar120),auVar126,auVar126);
  auVar126 = vrcp14ps_avx512vl(auVar128);
  auVar119 = vfnmadd213ps_fma(auVar128,auVar126,auVar219);
  auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar126,auVar126);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 7 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar8));
  auVar129._4_4_ = auVar31._4_4_ * auVar128._4_4_;
  auVar129._0_4_ = auVar31._0_4_ * auVar128._0_4_;
  auVar129._8_4_ = auVar31._8_4_ * auVar128._8_4_;
  auVar129._12_4_ = auVar31._12_4_ * auVar128._12_4_;
  auVar129._16_4_ = auVar128._16_4_ * 0.0;
  auVar129._20_4_ = auVar128._20_4_ * 0.0;
  auVar129._24_4_ = auVar128._24_4_ * 0.0;
  auVar129._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 9 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar8));
  auVar127 = vpbroadcastd_avx512vl();
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar137._0_4_ = auVar31._0_4_ * auVar128._0_4_;
  auVar137._4_4_ = auVar31._4_4_ * auVar128._4_4_;
  auVar137._8_4_ = auVar31._8_4_ * auVar128._8_4_;
  auVar137._12_4_ = auVar31._12_4_ * auVar128._12_4_;
  auVar137._16_4_ = auVar128._16_4_ * 0.0;
  auVar137._20_4_ = auVar128._20_4_ * 0.0;
  auVar137._24_4_ = auVar128._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar109 * -2 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar9));
  auVar130._4_4_ = auVar120._4_4_ * auVar128._4_4_;
  auVar130._0_4_ = auVar120._0_4_ * auVar128._0_4_;
  auVar130._8_4_ = auVar120._8_4_ * auVar128._8_4_;
  auVar130._12_4_ = auVar120._12_4_ * auVar128._12_4_;
  auVar130._16_4_ = auVar128._16_4_ * 0.0;
  auVar130._20_4_ = auVar128._20_4_ * 0.0;
  auVar130._24_4_ = auVar128._24_4_ * 0.0;
  auVar130._28_4_ = auVar128._28_4_;
  auVar220 = ZEXT3264(auVar130);
  auVar128 = vcvtdq2ps_avx(auVar126);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar9));
  auVar136._0_4_ = auVar120._0_4_ * auVar128._0_4_;
  auVar136._4_4_ = auVar120._4_4_ * auVar128._4_4_;
  auVar136._8_4_ = auVar120._8_4_ * auVar128._8_4_;
  auVar136._12_4_ = auVar120._12_4_ * auVar128._12_4_;
  auVar136._16_4_ = auVar128._16_4_ * 0.0;
  auVar136._20_4_ = auVar128._20_4_ * 0.0;
  auVar136._24_4_ = auVar128._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 + uVar109 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar238));
  auVar131._4_4_ = auVar128._4_4_ * auVar119._4_4_;
  auVar131._0_4_ = auVar128._0_4_ * auVar119._0_4_;
  auVar131._8_4_ = auVar128._8_4_ * auVar119._8_4_;
  auVar131._12_4_ = auVar128._12_4_ * auVar119._12_4_;
  auVar131._16_4_ = auVar128._16_4_ * 0.0;
  auVar131._20_4_ = auVar128._20_4_ * 0.0;
  auVar131._24_4_ = auVar128._24_4_ * 0.0;
  auVar131._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 0x17 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar238));
  auVar135._0_4_ = auVar119._0_4_ * auVar128._0_4_;
  auVar135._4_4_ = auVar119._4_4_ * auVar128._4_4_;
  auVar135._8_4_ = auVar119._8_4_ * auVar128._8_4_;
  auVar135._12_4_ = auVar119._12_4_ * auVar128._12_4_;
  auVar135._16_4_ = auVar128._16_4_ * 0.0;
  auVar135._20_4_ = auVar128._20_4_ * 0.0;
  auVar135._24_4_ = auVar128._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar128 = vpminsd_avx2(auVar129,auVar137);
  auVar126 = vpminsd_avx2(auVar130,auVar136);
  auVar128 = vmaxps_avx(auVar128,auVar126);
  auVar126 = vpminsd_avx2(auVar131,auVar135);
  uVar175 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar141._4_4_ = uVar175;
  auVar141._0_4_ = uVar175;
  auVar141._8_4_ = uVar175;
  auVar141._12_4_ = uVar175;
  auVar141._16_4_ = uVar175;
  auVar141._20_4_ = uVar175;
  auVar141._24_4_ = uVar175;
  auVar141._28_4_ = uVar175;
  auVar126 = vmaxps_avx512vl(auVar126,auVar141);
  auVar128 = vmaxps_avx(auVar128,auVar126);
  auVar126._8_4_ = 0x3f7ffffa;
  auVar126._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar126._12_4_ = 0x3f7ffffa;
  auVar126._16_4_ = 0x3f7ffffa;
  auVar126._20_4_ = 0x3f7ffffa;
  auVar126._24_4_ = 0x3f7ffffa;
  auVar126._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar128,auVar126);
  auVar203 = ZEXT3264(local_320);
  auVar128 = vpmaxsd_avx2(auVar129,auVar137);
  auVar126 = vpmaxsd_avx2(auVar130,auVar136);
  auVar128 = vminps_avx(auVar128,auVar126);
  auVar126 = vpmaxsd_avx2(auVar131,auVar135);
  uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar142._4_4_ = uVar175;
  auVar142._0_4_ = uVar175;
  auVar142._8_4_ = uVar175;
  auVar142._12_4_ = uVar175;
  auVar142._16_4_ = uVar175;
  auVar142._20_4_ = uVar175;
  auVar142._24_4_ = uVar175;
  auVar142._28_4_ = uVar175;
  auVar126 = vminps_avx512vl(auVar126,auVar142);
  auVar128 = vminps_avx(auVar128,auVar126);
  auVar140._8_4_ = 0x3f800003;
  auVar140._0_8_ = 0x3f8000033f800003;
  auVar140._12_4_ = 0x3f800003;
  auVar140._16_4_ = 0x3f800003;
  auVar140._20_4_ = 0x3f800003;
  auVar140._24_4_ = 0x3f800003;
  auVar140._28_4_ = 0x3f800003;
  auVar128 = vmulps_avx512vl(auVar128,auVar140);
  uVar34 = vpcmpgtd_avx512vl(auVar127,_DAT_0205a920);
  uVar32 = vcmpps_avx512vl(local_320,auVar128,2);
  if ((byte)((byte)uVar32 & (byte)uVar34) != 0) {
    uVar113 = (ulong)(byte)((byte)uVar32 & (byte)uVar34);
    local_7e8 = pre->ray_space + k;
    local_8c8 = (undefined1 (*) [32])local_100;
    auVar187 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar187);
    do {
      auVar126 = auVar220._0_32_;
      auVar128 = auVar203._0_32_;
      local_860 = in_ZMM21._0_32_;
      local_840 = in_ZMM20._0_32_;
      lVar35 = 0;
      for (uVar106 = uVar113; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
        lVar35 = lVar35 + 1;
      }
      uVar112 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar35 * 4 + 6);
      pGVar111 = (context->scene->geometries).items[uVar112].ptr;
      uVar106 = (ulong)*(uint *)(*(long *)&pGVar111->field_0x58 +
                                pGVar111[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar13);
      p_Var16 = pGVar111[1].intersectionFilterN;
      lVar35 = *(long *)&pGVar111[1].time_range.upper;
      auVar31 = *(undefined1 (*) [16])(lVar35 + (long)p_Var16 * uVar106);
      pauVar3 = (undefined1 (*) [16])(lVar35 + (uVar106 + 1) * (long)p_Var16);
      uVar32 = *(undefined8 *)*pauVar3;
      uVar34 = *(undefined8 *)(*pauVar3 + 8);
      auVar9 = *pauVar3;
      auVar120 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar35 + (uVar106 + 2) * (long)p_Var16);
      uVar97 = *(undefined8 *)*pauVar4;
      uVar98 = *(undefined8 *)(*pauVar4 + 8);
      auVar8 = *pauVar4;
      auVar119 = *pauVar4;
      uVar113 = uVar113 - 1 & uVar113;
      pauVar5 = (undefined1 (*) [12])(lVar35 + (uVar106 + 3) * (long)p_Var16);
      local_680 = *(undefined8 *)*pauVar5;
      uStack_678 = *(undefined8 *)(*pauVar5 + 8);
      local_8e0 = (float)local_680;
      fStack_8dc = (float)((ulong)local_680 >> 0x20);
      fStack_8d8 = (float)uStack_678;
      fStack_8d4 = (float)((ulong)uStack_678 >> 0x20);
      if (uVar113 != 0) {
        uVar109 = uVar113 - 1 & uVar113;
        for (uVar106 = uVar113; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
        }
        if (uVar109 != 0) {
          for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar111[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar238 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar238 = vinsertps_avx(auVar238,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar118 = vsubps_avx(auVar31,auVar238);
      uVar175 = auVar118._0_4_;
      auVar189._4_4_ = uVar175;
      auVar189._0_4_ = uVar175;
      auVar189._8_4_ = uVar175;
      auVar189._12_4_ = uVar175;
      auVar10 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vshufps_avx(auVar118,auVar118,0xaa);
      aVar6 = (local_7e8->vx).field_0;
      aVar7 = (local_7e8->vy).field_0;
      fVar205 = (local_7e8->vz).field_0.m128[0];
      fVar174 = *(float *)((long)&(local_7e8->vz).field_0 + 4);
      fVar211 = *(float *)((long)&(local_7e8->vz).field_0 + 8);
      fVar212 = *(float *)((long)&(local_7e8->vz).field_0 + 0xc);
      auVar224._0_4_ = fVar205 * auVar118._0_4_;
      auVar224._4_4_ = fVar174 * auVar118._4_4_;
      auVar224._8_4_ = fVar211 * auVar118._8_4_;
      auVar224._12_4_ = fVar212 * auVar118._12_4_;
      auVar10 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar10);
      auVar189 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar6,auVar189);
      auVar10 = vshufps_avx(auVar31,auVar31,0xff);
      auVar11 = vsubps_avx(auVar120,auVar238);
      uVar175 = auVar11._0_4_;
      auVar196._4_4_ = uVar175;
      auVar196._0_4_ = uVar175;
      auVar196._8_4_ = uVar175;
      auVar196._12_4_ = uVar175;
      auVar118 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar225._0_4_ = fVar205 * auVar11._0_4_;
      auVar225._4_4_ = fVar174 * auVar11._4_4_;
      auVar225._8_4_ = fVar211 * auVar11._8_4_;
      auVar225._12_4_ = fVar212 * auVar11._12_4_;
      auVar118 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar7,auVar118);
      auVar196 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar6,auVar196);
      auVar120 = vshufps_avx(auVar120,auVar120,0xff);
      auVar11 = vsubps_avx(auVar119,auVar238);
      uVar175 = auVar11._0_4_;
      auVar221._4_4_ = uVar175;
      auVar221._0_4_ = uVar175;
      auVar221._8_4_ = uVar175;
      auVar221._12_4_ = uVar175;
      auVar118 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar122._0_4_ = fVar205 * auVar11._0_4_;
      auVar122._4_4_ = fVar174 * auVar11._4_4_;
      auVar122._8_4_ = fVar211 * auVar11._8_4_;
      auVar122._12_4_ = fVar212 * auVar11._12_4_;
      auVar118 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar7,auVar118);
      auVar11 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar6,auVar221);
      auVar119 = vshufps_avx(auVar119,auVar119,0xff);
      auVar36._12_4_ = fStack_8d4;
      auVar36._0_12_ = *pauVar5;
      auVar118 = vsubps_avx512vl(auVar36,auVar238);
      uVar175 = auVar118._0_4_;
      auVar121._4_4_ = uVar175;
      auVar121._0_4_ = uVar175;
      auVar121._8_4_ = uVar175;
      auVar121._12_4_ = uVar175;
      auVar238 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vshufps_avx(auVar118,auVar118,0xaa);
      auVar227._0_4_ = fVar205 * auVar118._0_4_;
      auVar227._4_4_ = fVar174 * auVar118._4_4_;
      auVar227._8_4_ = fVar211 * auVar118._8_4_;
      auVar227._12_4_ = fVar212 * auVar118._12_4_;
      auVar238 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar7,auVar238);
      auVar238 = vfmadd231ps_fma(auVar238,(undefined1  [16])aVar6,auVar121);
      lVar35 = (long)iVar14 * 0x44;
      auVar141 = *(undefined1 (*) [32])(bezier_basis0 + lVar35);
      auVar118 = vshufps_avx512vl(auVar36,auVar36,0xff);
      local_7a0 = vbroadcastss_avx512vl(auVar189);
      auVar206._8_4_ = 1;
      auVar206._0_8_ = 0x100000001;
      auVar206._12_4_ = 1;
      auVar206._16_4_ = 1;
      auVar206._20_4_ = 1;
      auVar206._24_4_ = 1;
      auVar206._28_4_ = 1;
      local_7c0 = vpermps_avx512vl(auVar206,ZEXT1632(auVar189));
      uVar188 = auVar10._0_8_;
      local_340._8_8_ = uVar188;
      local_340._0_8_ = uVar188;
      local_340._16_8_ = uVar188;
      local_340._24_8_ = uVar188;
      auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x484);
      uVar175 = auVar196._0_4_;
      local_8c0._4_4_ = uVar175;
      local_8c0._0_4_ = uVar175;
      local_8c0._8_4_ = uVar175;
      local_8c0._12_4_ = uVar175;
      local_8c0._16_4_ = uVar175;
      local_8c0._20_4_ = uVar175;
      local_8c0._24_4_ = uVar175;
      local_8c0._28_4_ = uVar175;
      local_560 = vpermps_avx512vl(auVar206,ZEXT1632(auVar196));
      uVar188 = auVar120._0_8_;
      local_360._8_8_ = uVar188;
      local_360._0_8_ = uVar188;
      local_360._16_8_ = uVar188;
      local_360._24_8_ = uVar188;
      auVar140 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x908);
      local_380 = vbroadcastss_avx512vl(auVar11);
      local_3a0 = vpermps_avx512vl(auVar206,ZEXT1632(auVar11));
      local_3c0 = vbroadcastsd_avx512vl(auVar119);
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0xd8c);
      local_880 = vbroadcastss_avx512vl(auVar238);
      auVar187 = ZEXT3264(local_880);
      local_8a0 = vpermps_avx512vl(auVar206,ZEXT1632(auVar238));
      auVar240 = ZEXT3264(local_8a0);
      _local_3e0 = vbroadcastsd_avx512vl(auVar118);
      auVar129 = vmulps_avx512vl(local_880,auVar127);
      auVar130 = vmulps_avx512vl(local_8a0,auVar127);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar140,local_380);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar140,local_3a0);
      auVar120 = vfmadd231ps_fma(auVar129,auVar142,local_8c0);
      auVar131 = vfmadd231ps_avx512vl(auVar130,auVar142,local_560);
      auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar141,local_7a0);
      auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar35);
      auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x484);
      auVar132 = vfmadd231ps_avx512vl(auVar131,auVar141,local_7c0);
      auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x908);
      auVar139 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0xd8c);
      auVar133 = vmulps_avx512vl(local_880,auVar139);
      auVar123 = vmulps_avx512vl(local_8a0,auVar139);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar131,local_380);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar131,local_3a0);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar130,local_8c0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,local_560);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar129,local_7a0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar129,local_7c0);
      auVar124 = vsubps_avx512vl(auVar133,auVar125);
      auVar134 = vsubps_avx512vl(auVar123,auVar132);
      auVar135 = vmulps_avx512vl(auVar132,auVar124);
      auVar136 = vmulps_avx512vl(auVar125,auVar134);
      auVar135 = vsubps_avx512vl(auVar135,auVar136);
      auVar136 = vmulps_avx512vl(_local_3e0,auVar127);
      auVar136 = vfmadd231ps_avx512vl(auVar136,auVar140,local_3c0);
      auVar120 = vfmadd231ps_fma(auVar136,auVar142,local_360);
      auVar136 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar141,local_340);
      auVar137 = vmulps_avx512vl(_local_3e0,auVar139);
      auVar137 = vfmadd231ps_avx512vl(auVar137,auVar131,local_3c0);
      auVar137 = vfmadd231ps_avx512vl(auVar137,auVar130,local_360);
      auVar10 = vfmadd231ps_fma(auVar137,auVar129,local_340);
      auVar137 = vmulps_avx512vl(auVar134,auVar134);
      auVar137 = vfmadd231ps_avx512vl(auVar137,auVar124,auVar124);
      auVar138 = vmaxps_avx512vl(auVar136,ZEXT1632(auVar10));
      auVar138 = vmulps_avx512vl(auVar138,auVar138);
      auVar137 = vmulps_avx512vl(auVar138,auVar137);
      auVar135 = vmulps_avx512vl(auVar135,auVar135);
      uVar188 = vcmpps_avx512vl(auVar135,auVar137,2);
      auVar120 = vblendps_avx(auVar189,auVar31,8);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar119 = vandps_avx512vl(auVar120,auVar118);
      auVar120 = vblendps_avx(auVar196,*pauVar3,8);
      auVar120 = vandps_avx512vl(auVar120,auVar118);
      auVar119 = vmaxps_avx(auVar119,auVar120);
      auVar120 = vblendps_avx(auVar11,*pauVar4,8);
      auVar121 = vandps_avx512vl(auVar120,auVar118);
      auVar120 = vblendps_avx(auVar238,auVar36,8);
      auVar120 = vandps_avx512vl(auVar120,auVar118);
      auVar120 = vmaxps_avx(auVar121,auVar120);
      auVar120 = vmaxps_avx(auVar119,auVar120);
      auVar119 = vmovshdup_avx(auVar120);
      auVar119 = vmaxss_avx(auVar119,auVar120);
      auVar120 = vshufpd_avx(auVar120,auVar120,1);
      auVar120 = vmaxss_avx(auVar120,auVar119);
      auVar228._0_4_ = (float)iVar14;
      _auStack_73c = auVar189._4_12_;
      auVar228._4_4_ = auVar228._0_4_;
      auVar228._8_4_ = auVar228._0_4_;
      auVar228._12_4_ = auVar228._0_4_;
      auVar228._16_4_ = auVar228._0_4_;
      auVar228._20_4_ = auVar228._0_4_;
      auVar228._24_4_ = auVar228._0_4_;
      auVar228._28_4_ = auVar228._0_4_;
      uVar33 = vcmpps_avx512vl(auVar228,_DAT_02020f40,0xe);
      bVar115 = (byte)uVar188 & (byte)uVar33;
      auVar120 = vmulss_avx512f(auVar120,ZEXT416(0x35000000));
      auVar201._8_4_ = 2;
      auVar201._0_8_ = 0x200000002;
      auVar201._12_4_ = 2;
      auVar201._16_4_ = 2;
      auVar201._20_4_ = 2;
      auVar201._24_4_ = 2;
      auVar201._28_4_ = 2;
      local_400 = vpermps_avx512vl(auVar201,ZEXT1632(auVar189));
      local_420 = vpermps_avx512vl(auVar201,ZEXT1632(auVar196));
      local_440 = vpermps_avx512vl(auVar201,ZEXT1632(auVar11));
      local_460 = vpermps_avx2(auVar201,ZEXT1632(auVar238));
      uVar110 = *(uint *)(ray + k * 4 + 0xc0);
      auVar119 = local_560._0_16_;
      local_740 = auVar228._0_4_;
      if (bVar115 == 0) {
        auVar119 = vxorps_avx512vl(auVar119,auVar119);
        auVar239 = ZEXT1664(auVar119);
        auVar220 = ZEXT3264(auVar126);
        in_ZMM20 = ZEXT3264(local_840);
        auVar203 = ZEXT3264(auVar128);
        in_ZMM21 = ZEXT3264(local_860);
        auVar236 = ZEXT3264(local_7a0);
        auVar235 = ZEXT3264(local_7c0);
        auVar234 = ZEXT3264(local_8c0);
      }
      else {
        local_7e0._0_16_ = ZEXT416(uVar110);
        local_780._0_16_ = auVar120;
        auVar139 = vmulps_avx512vl(local_460,auVar139);
        auVar131 = vfmadd213ps_avx512vl(auVar131,local_440,auVar139);
        auVar130 = vfmadd213ps_avx512vl(auVar130,local_420,auVar131);
        auVar130 = vfmadd213ps_avx512vl(auVar129,local_400,auVar130);
        auVar127 = vmulps_avx512vl(local_460,auVar127);
        auVar140 = vfmadd213ps_avx512vl(auVar140,local_440,auVar127);
        auVar131 = vfmadd213ps_avx512vl(auVar142,local_420,auVar140);
        auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x1210);
        auVar140 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x1694);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x1b18);
        auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 + 0x1f9c);
        auVar131 = vfmadd213ps_avx512vl(auVar141,local_400,auVar131);
        auVar141 = vmulps_avx512vl(local_880,auVar129);
        auVar139 = vmulps_avx512vl(local_8a0,auVar129);
        auVar129 = vmulps_avx512vl(local_460,auVar129);
        auVar141 = vfmadd231ps_avx512vl(auVar141,auVar127,local_380);
        auVar139 = vfmadd231ps_avx512vl(auVar139,auVar127,local_3a0);
        auVar127 = vfmadd231ps_avx512vl(auVar129,local_440,auVar127);
        auVar141 = vfmadd231ps_avx512vl(auVar141,auVar140,local_8c0);
        auVar129 = vfmadd231ps_avx512vl(auVar139,auVar140,local_560);
        auVar139 = vfmadd231ps_avx512vl(auVar127,local_420,auVar140);
        auVar135 = vfmadd231ps_avx512vl(auVar141,auVar142,local_7a0);
        auVar235 = ZEXT3264(local_7c0);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar142,local_7c0);
        auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x1210);
        auVar140 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x1b18);
        auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x1f9c);
        auVar139 = vfmadd231ps_avx512vl(auVar139,local_400,auVar142);
        auVar142 = vmulps_avx512vl(local_880,auVar127);
        auVar137 = vmulps_avx512vl(local_8a0,auVar127);
        auVar127 = vmulps_avx512vl(local_460,auVar127);
        auVar237 = ZEXT1664(auVar120);
        auVar138 = vfmadd231ps_avx512vl(auVar142,auVar140,local_380);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar140,local_3a0);
        auVar140 = vfmadd231ps_avx512vl(auVar127,local_440,auVar140);
        auVar142 = *(undefined1 (*) [32])(bezier_basis1 + lVar35 + 0x1694);
        auVar127 = vfmadd231ps_avx512vl(auVar138,auVar142,local_8c0);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar142,local_560);
        auVar142 = vfmadd231ps_avx512vl(auVar140,local_420,auVar142);
        auVar140 = vfmadd231ps_avx512vl(auVar127,auVar141,local_7a0);
        auVar127 = vfmadd231ps_avx512vl(auVar137,auVar141,local_7c0);
        auVar137 = vfmadd231ps_avx512vl(auVar142,local_400,auVar141);
        auVar232._8_4_ = 0x7fffffff;
        auVar232._0_8_ = 0x7fffffff7fffffff;
        auVar232._12_4_ = 0x7fffffff;
        auVar232._16_4_ = 0x7fffffff;
        auVar232._20_4_ = 0x7fffffff;
        auVar232._24_4_ = 0x7fffffff;
        auVar232._28_4_ = 0x7fffffff;
        auVar141 = vandps_avx(auVar135,auVar232);
        auVar142 = vandps_avx(auVar129,auVar232);
        auVar142 = vmaxps_avx(auVar141,auVar142);
        auVar141 = vandps_avx(auVar139,auVar232);
        auVar141 = vmaxps_avx(auVar142,auVar141);
        auVar139 = vbroadcastss_avx512vl(auVar120);
        uVar106 = vcmpps_avx512vl(auVar141,auVar139,1);
        bVar17 = (bool)((byte)uVar106 & 1);
        auVar143._0_4_ = (float)((uint)bVar17 * auVar124._0_4_ | (uint)!bVar17 * auVar135._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * auVar135._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * auVar135._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * auVar135._12_4_);
        bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
        auVar143._16_4_ = (float)((uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * auVar135._16_4_);
        bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
        auVar143._20_4_ = (float)((uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * auVar135._20_4_);
        bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
        auVar143._24_4_ = (float)((uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * auVar135._24_4_);
        bVar17 = SUB81(uVar106 >> 7,0);
        auVar143._28_4_ = (uint)bVar17 * auVar124._28_4_ | (uint)!bVar17 * auVar135._28_4_;
        bVar17 = (bool)((byte)uVar106 & 1);
        auVar144._0_4_ = (float)((uint)bVar17 * auVar134._0_4_ | (uint)!bVar17 * auVar129._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar144._4_4_ = (float)((uint)bVar17 * auVar134._4_4_ | (uint)!bVar17 * auVar129._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar144._8_4_ = (float)((uint)bVar17 * auVar134._8_4_ | (uint)!bVar17 * auVar129._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar144._12_4_ = (float)((uint)bVar17 * auVar134._12_4_ | (uint)!bVar17 * auVar129._12_4_);
        bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
        auVar144._16_4_ = (float)((uint)bVar17 * auVar134._16_4_ | (uint)!bVar17 * auVar129._16_4_);
        bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
        auVar144._20_4_ = (float)((uint)bVar17 * auVar134._20_4_ | (uint)!bVar17 * auVar129._20_4_);
        bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
        auVar144._24_4_ = (float)((uint)bVar17 * auVar134._24_4_ | (uint)!bVar17 * auVar129._24_4_);
        bVar17 = SUB81(uVar106 >> 7,0);
        auVar144._28_4_ = (uint)bVar17 * auVar134._28_4_ | (uint)!bVar17 * auVar129._28_4_;
        auVar141 = vandps_avx(auVar232,auVar140);
        auVar142 = vandps_avx(auVar127,auVar232);
        auVar142 = vmaxps_avx(auVar141,auVar142);
        auVar141 = vandps_avx(auVar137,auVar232);
        auVar141 = vmaxps_avx(auVar142,auVar141);
        uVar106 = vcmpps_avx512vl(auVar141,auVar139,1);
        bVar17 = (bool)((byte)uVar106 & 1);
        auVar145._0_4_ = (float)((uint)bVar17 * auVar124._0_4_ | (uint)!bVar17 * auVar140._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar145._4_4_ = (float)((uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * auVar140._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar145._8_4_ = (float)((uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * auVar140._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar145._12_4_ = (float)((uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * auVar140._12_4_);
        bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
        auVar145._16_4_ = (float)((uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * auVar140._16_4_);
        bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
        auVar145._20_4_ = (float)((uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * auVar140._20_4_);
        bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
        auVar145._24_4_ = (float)((uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * auVar140._24_4_);
        bVar17 = SUB81(uVar106 >> 7,0);
        auVar145._28_4_ = (uint)bVar17 * auVar124._28_4_ | (uint)!bVar17 * auVar140._28_4_;
        bVar17 = (bool)((byte)uVar106 & 1);
        auVar146._0_4_ = (float)((uint)bVar17 * auVar134._0_4_ | (uint)!bVar17 * auVar127._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar146._4_4_ = (float)((uint)bVar17 * auVar134._4_4_ | (uint)!bVar17 * auVar127._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar146._8_4_ = (float)((uint)bVar17 * auVar134._8_4_ | (uint)!bVar17 * auVar127._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar146._12_4_ = (float)((uint)bVar17 * auVar134._12_4_ | (uint)!bVar17 * auVar127._12_4_);
        bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
        auVar146._16_4_ = (float)((uint)bVar17 * auVar134._16_4_ | (uint)!bVar17 * auVar127._16_4_);
        bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
        auVar146._20_4_ = (float)((uint)bVar17 * auVar134._20_4_ | (uint)!bVar17 * auVar127._20_4_);
        bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
        auVar146._24_4_ = (float)((uint)bVar17 * auVar134._24_4_ | (uint)!bVar17 * auVar127._24_4_);
        bVar17 = SUB81(uVar106 >> 7,0);
        auVar146._28_4_ = (uint)bVar17 * auVar134._28_4_ | (uint)!bVar17 * auVar127._28_4_;
        auVar122 = vxorps_avx512vl(auVar119,auVar119);
        auVar239 = ZEXT1664(auVar122);
        auVar141 = vfmadd213ps_avx512vl(auVar143,auVar143,ZEXT1632(auVar122));
        auVar119 = vfmadd231ps_fma(auVar141,auVar144,auVar144);
        auVar141 = vrsqrt14ps_avx512vl(ZEXT1632(auVar119));
        fVar205 = auVar141._0_4_;
        fVar174 = auVar141._4_4_;
        fVar211 = auVar141._8_4_;
        fVar212 = auVar141._12_4_;
        fVar195 = auVar141._16_4_;
        fVar204 = auVar141._20_4_;
        fVar116 = auVar141._24_4_;
        auVar48._4_4_ = fVar174 * fVar174 * fVar174 * auVar119._4_4_ * -0.5;
        auVar48._0_4_ = fVar205 * fVar205 * fVar205 * auVar119._0_4_ * -0.5;
        auVar48._8_4_ = fVar211 * fVar211 * fVar211 * auVar119._8_4_ * -0.5;
        auVar48._12_4_ = fVar212 * fVar212 * fVar212 * auVar119._12_4_ * -0.5;
        auVar48._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar48._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
        auVar48._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar48._28_4_ = 0;
        auVar142 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar140 = vfmadd231ps_avx512vl(auVar48,auVar142,auVar141);
        auVar49._4_4_ = auVar144._4_4_ * auVar140._4_4_;
        auVar49._0_4_ = auVar144._0_4_ * auVar140._0_4_;
        auVar49._8_4_ = auVar144._8_4_ * auVar140._8_4_;
        auVar49._12_4_ = auVar144._12_4_ * auVar140._12_4_;
        auVar49._16_4_ = auVar144._16_4_ * auVar140._16_4_;
        auVar49._20_4_ = auVar144._20_4_ * auVar140._20_4_;
        auVar49._24_4_ = auVar144._24_4_ * auVar140._24_4_;
        auVar49._28_4_ = auVar141._28_4_;
        auVar50._4_4_ = auVar140._4_4_ * -auVar143._4_4_;
        auVar50._0_4_ = auVar140._0_4_ * -auVar143._0_4_;
        auVar50._8_4_ = auVar140._8_4_ * -auVar143._8_4_;
        auVar50._12_4_ = auVar140._12_4_ * -auVar143._12_4_;
        auVar50._16_4_ = auVar140._16_4_ * -auVar143._16_4_;
        auVar50._20_4_ = auVar140._20_4_ * -auVar143._20_4_;
        auVar50._24_4_ = auVar140._24_4_ * -auVar143._24_4_;
        auVar50._28_4_ = auVar143._28_4_ ^ 0x80000000;
        auVar141 = vmulps_avx512vl(auVar140,ZEXT1632(auVar122));
        auVar124 = ZEXT1632(auVar122);
        auVar127 = vfmadd213ps_avx512vl(auVar145,auVar145,auVar124);
        auVar119 = vfmadd231ps_fma(auVar127,auVar146,auVar146);
        auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar119));
        fVar205 = auVar127._0_4_;
        fVar174 = auVar127._4_4_;
        fVar211 = auVar127._8_4_;
        fVar212 = auVar127._12_4_;
        fVar195 = auVar127._16_4_;
        fVar204 = auVar127._20_4_;
        fVar116 = auVar127._24_4_;
        auVar51._4_4_ = fVar174 * fVar174 * fVar174 * auVar119._4_4_ * -0.5;
        auVar51._0_4_ = fVar205 * fVar205 * fVar205 * auVar119._0_4_ * -0.5;
        auVar51._8_4_ = fVar211 * fVar211 * fVar211 * auVar119._8_4_ * -0.5;
        auVar51._12_4_ = fVar212 * fVar212 * fVar212 * auVar119._12_4_ * -0.5;
        auVar51._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar51._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
        auVar51._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar51._28_4_ = 0;
        auVar142 = vfmadd231ps_avx512vl(auVar51,auVar142,auVar127);
        auVar52._4_4_ = auVar146._4_4_ * auVar142._4_4_;
        auVar52._0_4_ = auVar146._0_4_ * auVar142._0_4_;
        auVar52._8_4_ = auVar146._8_4_ * auVar142._8_4_;
        auVar52._12_4_ = auVar146._12_4_ * auVar142._12_4_;
        auVar52._16_4_ = auVar146._16_4_ * auVar142._16_4_;
        auVar52._20_4_ = auVar146._20_4_ * auVar142._20_4_;
        auVar52._24_4_ = auVar146._24_4_ * auVar142._24_4_;
        auVar52._28_4_ = auVar127._28_4_;
        auVar53._4_4_ = -auVar145._4_4_ * auVar142._4_4_;
        auVar53._0_4_ = -auVar145._0_4_ * auVar142._0_4_;
        auVar53._8_4_ = -auVar145._8_4_ * auVar142._8_4_;
        auVar53._12_4_ = -auVar145._12_4_ * auVar142._12_4_;
        auVar53._16_4_ = -auVar145._16_4_ * auVar142._16_4_;
        auVar53._20_4_ = -auVar145._20_4_ * auVar142._20_4_;
        auVar53._24_4_ = -auVar145._24_4_ * auVar142._24_4_;
        auVar53._28_4_ = auVar140._28_4_;
        auVar142 = vmulps_avx512vl(auVar142,auVar124);
        auVar119 = vfmadd213ps_fma(auVar49,auVar136,auVar125);
        auVar238 = vfmadd213ps_fma(auVar50,auVar136,auVar132);
        auVar140 = vfmadd213ps_avx512vl(auVar141,auVar136,auVar131);
        auVar127 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar10),auVar133);
        auVar36 = vfnmadd213ps_fma(auVar49,auVar136,auVar125);
        auVar139 = ZEXT1632(auVar10);
        auVar118 = vfmadd213ps_fma(auVar53,auVar139,auVar123);
        auVar121 = vfnmadd213ps_fma(auVar50,auVar136,auVar132);
        auVar11 = vfmadd213ps_fma(auVar142,auVar139,auVar130);
        auVar129 = vfnmadd231ps_avx512vl(auVar131,auVar136,auVar141);
        auVar221 = vfnmadd213ps_fma(auVar52,auVar139,auVar133);
        auVar224 = vfnmadd213ps_fma(auVar53,auVar139,auVar123);
        auVar225 = vfnmadd231ps_fma(auVar130,ZEXT1632(auVar10),auVar142);
        auVar142 = vsubps_avx512vl(auVar127,ZEXT1632(auVar36));
        auVar141 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar121));
        auVar130 = vsubps_avx512vl(ZEXT1632(auVar11),auVar129);
        auVar131 = vmulps_avx512vl(auVar141,auVar129);
        auVar189 = vfmsub231ps_fma(auVar131,ZEXT1632(auVar121),auVar130);
        auVar54._4_4_ = auVar36._4_4_ * auVar130._4_4_;
        auVar54._0_4_ = auVar36._0_4_ * auVar130._0_4_;
        auVar54._8_4_ = auVar36._8_4_ * auVar130._8_4_;
        auVar54._12_4_ = auVar36._12_4_ * auVar130._12_4_;
        auVar54._16_4_ = auVar130._16_4_ * 0.0;
        auVar54._20_4_ = auVar130._20_4_ * 0.0;
        auVar54._24_4_ = auVar130._24_4_ * 0.0;
        auVar54._28_4_ = auVar130._28_4_;
        auVar130 = vfmsub231ps_avx512vl(auVar54,auVar129,auVar142);
        auVar55._4_4_ = auVar121._4_4_ * auVar142._4_4_;
        auVar55._0_4_ = auVar121._0_4_ * auVar142._0_4_;
        auVar55._8_4_ = auVar121._8_4_ * auVar142._8_4_;
        auVar55._12_4_ = auVar121._12_4_ * auVar142._12_4_;
        auVar55._16_4_ = auVar142._16_4_ * 0.0;
        auVar55._20_4_ = auVar142._20_4_ * 0.0;
        auVar55._24_4_ = auVar142._24_4_ * 0.0;
        auVar55._28_4_ = auVar142._28_4_;
        auVar196 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar36),auVar141);
        auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar196),auVar124,auVar130);
        auVar141 = vfmadd231ps_avx512vl(auVar141,auVar124,ZEXT1632(auVar189));
        auVar123 = ZEXT1632(auVar122);
        uVar106 = vcmpps_avx512vl(auVar141,auVar123,2);
        bVar105 = (byte)uVar106;
        fVar116 = (float)((uint)(bVar105 & 1) * auVar119._0_4_ |
                         (uint)!(bool)(bVar105 & 1) * auVar221._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        fVar194 = (float)((uint)bVar17 * auVar119._4_4_ | (uint)!bVar17 * auVar221._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        fVar167 = (float)((uint)bVar17 * auVar119._8_4_ | (uint)!bVar17 * auVar221._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        fVar170 = (float)((uint)bVar17 * auVar119._12_4_ | (uint)!bVar17 * auVar221._12_4_);
        auVar131 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar167,CONCAT44(fVar194,fVar116))));
        fVar117 = (float)((uint)(bVar105 & 1) * auVar238._0_4_ |
                         (uint)!(bool)(bVar105 & 1) * auVar224._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        fVar166 = (float)((uint)bVar17 * auVar238._4_4_ | (uint)!bVar17 * auVar224._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        fVar168 = (float)((uint)bVar17 * auVar238._8_4_ | (uint)!bVar17 * auVar224._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        fVar171 = (float)((uint)bVar17 * auVar238._12_4_ | (uint)!bVar17 * auVar224._12_4_);
        auVar139 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar168,CONCAT44(fVar166,fVar117))));
        auVar147._0_4_ =
             (float)((uint)(bVar105 & 1) * auVar140._0_4_ |
                    (uint)!(bool)(bVar105 & 1) * auVar225._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar147._4_4_ = (float)((uint)bVar17 * auVar140._4_4_ | (uint)!bVar17 * auVar225._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar147._8_4_ = (float)((uint)bVar17 * auVar140._8_4_ | (uint)!bVar17 * auVar225._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar147._12_4_ = (float)((uint)bVar17 * auVar140._12_4_ | (uint)!bVar17 * auVar225._12_4_);
        fVar205 = (float)((uint)((byte)(uVar106 >> 4) & 1) * auVar140._16_4_);
        auVar147._16_4_ = fVar205;
        fVar174 = (float)((uint)((byte)(uVar106 >> 5) & 1) * auVar140._20_4_);
        auVar147._20_4_ = fVar174;
        fVar211 = (float)((uint)((byte)(uVar106 >> 6) & 1) * auVar140._24_4_);
        auVar147._24_4_ = fVar211;
        iVar1 = (uint)(byte)(uVar106 >> 7) * auVar140._28_4_;
        auVar147._28_4_ = iVar1;
        auVar142 = vblendmps_avx512vl(ZEXT1632(auVar36),auVar127);
        auVar148._0_4_ =
             (uint)(bVar105 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar105 & 1) * auVar189._0_4_;
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar17 * auVar142._4_4_ | (uint)!bVar17 * auVar189._4_4_;
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar17 * auVar142._8_4_ | (uint)!bVar17 * auVar189._8_4_;
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar17 * auVar142._12_4_ | (uint)!bVar17 * auVar189._12_4_;
        auVar148._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * auVar142._16_4_;
        auVar148._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * auVar142._20_4_;
        auVar148._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * auVar142._24_4_;
        auVar148._28_4_ = (uint)(byte)(uVar106 >> 7) * auVar142._28_4_;
        auVar142 = vblendmps_avx512vl(ZEXT1632(auVar121),ZEXT1632(auVar118));
        auVar149._0_4_ =
             (float)((uint)(bVar105 & 1) * auVar142._0_4_ |
                    (uint)!(bool)(bVar105 & 1) * auVar238._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar149._4_4_ = (float)((uint)bVar17 * auVar142._4_4_ | (uint)!bVar17 * auVar238._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar149._8_4_ = (float)((uint)bVar17 * auVar142._8_4_ | (uint)!bVar17 * auVar238._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar149._12_4_ = (float)((uint)bVar17 * auVar142._12_4_ | (uint)!bVar17 * auVar238._12_4_);
        fVar212 = (float)((uint)((byte)(uVar106 >> 4) & 1) * auVar142._16_4_);
        auVar149._16_4_ = fVar212;
        fVar195 = (float)((uint)((byte)(uVar106 >> 5) & 1) * auVar142._20_4_);
        auVar149._20_4_ = fVar195;
        fVar204 = (float)((uint)((byte)(uVar106 >> 6) & 1) * auVar142._24_4_);
        auVar149._24_4_ = fVar204;
        auVar149._28_4_ = (uint)(byte)(uVar106 >> 7) * auVar142._28_4_;
        auVar142 = vblendmps_avx512vl(auVar129,ZEXT1632(auVar11));
        auVar150._0_4_ =
             (float)((uint)(bVar105 & 1) * auVar142._0_4_ |
                    (uint)!(bool)(bVar105 & 1) * auVar140._0_4_);
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar150._4_4_ = (float)((uint)bVar17 * auVar142._4_4_ | (uint)!bVar17 * auVar140._4_4_);
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar150._8_4_ = (float)((uint)bVar17 * auVar142._8_4_ | (uint)!bVar17 * auVar140._8_4_);
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar150._12_4_ = (float)((uint)bVar17 * auVar142._12_4_ | (uint)!bVar17 * auVar140._12_4_);
        bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
        auVar150._16_4_ = (float)((uint)bVar17 * auVar142._16_4_ | (uint)!bVar17 * auVar140._16_4_);
        bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
        auVar150._20_4_ = (float)((uint)bVar17 * auVar142._20_4_ | (uint)!bVar17 * auVar140._20_4_);
        bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
        auVar150._24_4_ = (float)((uint)bVar17 * auVar142._24_4_ | (uint)!bVar17 * auVar140._24_4_);
        bVar17 = SUB81(uVar106 >> 7,0);
        auVar150._28_4_ = (uint)bVar17 * auVar142._28_4_ | (uint)!bVar17 * auVar140._28_4_;
        auVar151._0_4_ =
             (uint)(bVar105 & 1) * (int)auVar36._0_4_ | (uint)!(bool)(bVar105 & 1) * auVar127._0_4_;
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar151._4_4_ = (uint)bVar17 * (int)auVar36._4_4_ | (uint)!bVar17 * auVar127._4_4_;
        bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar151._8_4_ = (uint)bVar17 * (int)auVar36._8_4_ | (uint)!bVar17 * auVar127._8_4_;
        bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar151._12_4_ = (uint)bVar17 * (int)auVar36._12_4_ | (uint)!bVar17 * auVar127._12_4_;
        auVar151._16_4_ = (uint)!(bool)((byte)(uVar106 >> 4) & 1) * auVar127._16_4_;
        auVar151._20_4_ = (uint)!(bool)((byte)(uVar106 >> 5) & 1) * auVar127._20_4_;
        auVar151._24_4_ = (uint)!(bool)((byte)(uVar106 >> 6) & 1) * auVar127._24_4_;
        auVar151._28_4_ = (uint)!SUB81(uVar106 >> 7,0) * auVar127._28_4_;
        bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar152._0_4_ =
             (uint)(bVar105 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar105 & 1) * auVar11._0_4_;
        bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
        auVar152._4_4_ = (uint)bVar18 * auVar129._4_4_ | (uint)!bVar18 * auVar11._4_4_;
        bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
        auVar152._8_4_ = (uint)bVar18 * auVar129._8_4_ | (uint)!bVar18 * auVar11._8_4_;
        bVar18 = (bool)((byte)(uVar106 >> 3) & 1);
        auVar152._12_4_ = (uint)bVar18 * auVar129._12_4_ | (uint)!bVar18 * auVar11._12_4_;
        auVar152._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * auVar129._16_4_;
        auVar152._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * auVar129._20_4_;
        auVar152._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * auVar129._24_4_;
        iVar2 = (uint)(byte)(uVar106 >> 7) * auVar129._28_4_;
        auVar152._28_4_ = iVar2;
        auVar125 = vsubps_avx512vl(auVar151,auVar131);
        auVar142 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar121._12_4_ |
                                                 (uint)!bVar20 * auVar118._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar121._8_4_ |
                                                          (uint)!bVar19 * auVar118._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar121._4_4_ |
                                                                   (uint)!bVar17 * auVar118._4_4_,
                                                                   (uint)(bVar105 & 1) *
                                                                   (int)auVar121._0_4_ |
                                                                   (uint)!(bool)(bVar105 & 1) *
                                                                   auVar118._0_4_)))),auVar139);
        auVar140 = vsubps_avx(auVar152,auVar147);
        auVar127 = vsubps_avx(auVar131,auVar148);
        auVar129 = vsubps_avx(auVar139,auVar149);
        auVar130 = vsubps_avx(auVar147,auVar150);
        auVar56._4_4_ = auVar140._4_4_ * fVar194;
        auVar56._0_4_ = auVar140._0_4_ * fVar116;
        auVar56._8_4_ = auVar140._8_4_ * fVar167;
        auVar56._12_4_ = auVar140._12_4_ * fVar170;
        auVar56._16_4_ = auVar140._16_4_ * 0.0;
        auVar56._20_4_ = auVar140._20_4_ * 0.0;
        auVar56._24_4_ = auVar140._24_4_ * 0.0;
        auVar56._28_4_ = iVar2;
        auVar119 = vfmsub231ps_fma(auVar56,auVar147,auVar125);
        auVar57._4_4_ = fVar166 * auVar125._4_4_;
        auVar57._0_4_ = fVar117 * auVar125._0_4_;
        auVar57._8_4_ = fVar168 * auVar125._8_4_;
        auVar57._12_4_ = fVar171 * auVar125._12_4_;
        auVar57._16_4_ = auVar125._16_4_ * 0.0;
        auVar57._20_4_ = auVar125._20_4_ * 0.0;
        auVar57._24_4_ = auVar125._24_4_ * 0.0;
        auVar57._28_4_ = auVar141._28_4_;
        auVar238 = vfmsub231ps_fma(auVar57,auVar131,auVar142);
        auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar238),auVar123,ZEXT1632(auVar119));
        auVar207._0_4_ = auVar142._0_4_ * auVar147._0_4_;
        auVar207._4_4_ = auVar142._4_4_ * auVar147._4_4_;
        auVar207._8_4_ = auVar142._8_4_ * auVar147._8_4_;
        auVar207._12_4_ = auVar142._12_4_ * auVar147._12_4_;
        auVar207._16_4_ = auVar142._16_4_ * fVar205;
        auVar207._20_4_ = auVar142._20_4_ * fVar174;
        auVar207._24_4_ = auVar142._24_4_ * fVar211;
        auVar207._28_4_ = 0;
        auVar119 = vfmsub231ps_fma(auVar207,auVar139,auVar140);
        auVar132 = vfmadd231ps_avx512vl(auVar141,auVar123,ZEXT1632(auVar119));
        auVar141 = vmulps_avx512vl(auVar130,auVar148);
        auVar141 = vfmsub231ps_avx512vl(auVar141,auVar127,auVar150);
        auVar58._4_4_ = auVar129._4_4_ * auVar150._4_4_;
        auVar58._0_4_ = auVar129._0_4_ * auVar150._0_4_;
        auVar58._8_4_ = auVar129._8_4_ * auVar150._8_4_;
        auVar58._12_4_ = auVar129._12_4_ * auVar150._12_4_;
        auVar58._16_4_ = auVar129._16_4_ * auVar150._16_4_;
        auVar58._20_4_ = auVar129._20_4_ * auVar150._20_4_;
        auVar58._24_4_ = auVar129._24_4_ * auVar150._24_4_;
        auVar58._28_4_ = auVar150._28_4_;
        auVar119 = vfmsub231ps_fma(auVar58,auVar149,auVar130);
        auVar208._0_4_ = auVar149._0_4_ * auVar127._0_4_;
        auVar208._4_4_ = auVar149._4_4_ * auVar127._4_4_;
        auVar208._8_4_ = auVar149._8_4_ * auVar127._8_4_;
        auVar208._12_4_ = auVar149._12_4_ * auVar127._12_4_;
        auVar208._16_4_ = fVar212 * auVar127._16_4_;
        auVar208._20_4_ = fVar195 * auVar127._20_4_;
        auVar208._24_4_ = fVar204 * auVar127._24_4_;
        auVar208._28_4_ = 0;
        auVar238 = vfmsub231ps_fma(auVar208,auVar129,auVar148);
        auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar238),auVar123,auVar141);
        auVar133 = vfmadd231ps_avx512vl(auVar141,auVar123,ZEXT1632(auVar119));
        auVar141 = vmaxps_avx(auVar132,auVar133);
        uVar188 = vcmpps_avx512vl(auVar141,auVar123,2);
        bVar115 = bVar115 & (byte)uVar188;
        in_ZMM20 = ZEXT3264(local_840);
        in_ZMM21 = ZEXT3264(local_860);
        auVar236 = ZEXT3264(local_7a0);
        auVar234 = ZEXT3264(local_8c0);
        if (bVar115 == 0) {
          bVar115 = 0;
          auVar220 = ZEXT3264(auVar126);
          auVar203 = ZEXT3264(auVar128);
        }
        else {
          auVar59._4_4_ = auVar130._4_4_ * auVar142._4_4_;
          auVar59._0_4_ = auVar130._0_4_ * auVar142._0_4_;
          auVar59._8_4_ = auVar130._8_4_ * auVar142._8_4_;
          auVar59._12_4_ = auVar130._12_4_ * auVar142._12_4_;
          auVar59._16_4_ = auVar130._16_4_ * auVar142._16_4_;
          auVar59._20_4_ = auVar130._20_4_ * auVar142._20_4_;
          auVar59._24_4_ = auVar130._24_4_ * auVar142._24_4_;
          auVar59._28_4_ = auVar141._28_4_;
          auVar118 = vfmsub231ps_fma(auVar59,auVar129,auVar140);
          auVar60._4_4_ = auVar140._4_4_ * auVar127._4_4_;
          auVar60._0_4_ = auVar140._0_4_ * auVar127._0_4_;
          auVar60._8_4_ = auVar140._8_4_ * auVar127._8_4_;
          auVar60._12_4_ = auVar140._12_4_ * auVar127._12_4_;
          auVar60._16_4_ = auVar140._16_4_ * auVar127._16_4_;
          auVar60._20_4_ = auVar140._20_4_ * auVar127._20_4_;
          auVar60._24_4_ = auVar140._24_4_ * auVar127._24_4_;
          auVar60._28_4_ = auVar140._28_4_;
          auVar238 = vfmsub231ps_fma(auVar60,auVar125,auVar130);
          auVar61._4_4_ = auVar129._4_4_ * auVar125._4_4_;
          auVar61._0_4_ = auVar129._0_4_ * auVar125._0_4_;
          auVar61._8_4_ = auVar129._8_4_ * auVar125._8_4_;
          auVar61._12_4_ = auVar129._12_4_ * auVar125._12_4_;
          auVar61._16_4_ = auVar129._16_4_ * auVar125._16_4_;
          auVar61._20_4_ = auVar129._20_4_ * auVar125._20_4_;
          auVar61._24_4_ = auVar129._24_4_ * auVar125._24_4_;
          auVar61._28_4_ = auVar129._28_4_;
          auVar11 = vfmsub231ps_fma(auVar61,auVar127,auVar142);
          auVar119 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar238),ZEXT1632(auVar11));
          auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar118),auVar123);
          auVar142 = vrcp14ps_avx512vl(auVar141);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = &DAT_3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar37._16_4_ = 0x3f800000;
          auVar37._20_4_ = 0x3f800000;
          auVar37._24_4_ = 0x3f800000;
          auVar37._28_4_ = 0x3f800000;
          auVar140 = vfnmadd213ps_avx512vl(auVar142,auVar141,auVar37);
          auVar119 = vfmadd132ps_fma(auVar140,auVar142,auVar142);
          auVar62._4_4_ = auVar11._4_4_ * auVar147._4_4_;
          auVar62._0_4_ = auVar11._0_4_ * auVar147._0_4_;
          auVar62._8_4_ = auVar11._8_4_ * auVar147._8_4_;
          auVar62._12_4_ = auVar11._12_4_ * auVar147._12_4_;
          auVar62._16_4_ = fVar205 * 0.0;
          auVar62._20_4_ = fVar174 * 0.0;
          auVar62._24_4_ = fVar211 * 0.0;
          auVar62._28_4_ = iVar1;
          auVar238 = vfmadd231ps_fma(auVar62,auVar139,ZEXT1632(auVar238));
          auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),auVar131,ZEXT1632(auVar118));
          fVar205 = auVar119._0_4_;
          fVar174 = auVar119._4_4_;
          fVar211 = auVar119._8_4_;
          fVar212 = auVar119._12_4_;
          auVar142 = ZEXT1632(CONCAT412(auVar238._12_4_ * fVar212,
                                        CONCAT48(auVar238._8_4_ * fVar211,
                                                 CONCAT44(auVar238._4_4_ * fVar174,
                                                          auVar238._0_4_ * fVar205))));
          auVar223._4_4_ = uVar110;
          auVar223._0_4_ = uVar110;
          auVar223._8_4_ = uVar110;
          auVar223._12_4_ = uVar110;
          auVar223._16_4_ = uVar110;
          auVar223._20_4_ = uVar110;
          auVar223._24_4_ = uVar110;
          auVar223._28_4_ = uVar110;
          uVar188 = vcmpps_avx512vl(auVar223,auVar142,2);
          uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar38._4_4_ = uVar175;
          auVar38._0_4_ = uVar175;
          auVar38._8_4_ = uVar175;
          auVar38._12_4_ = uVar175;
          auVar38._16_4_ = uVar175;
          auVar38._20_4_ = uVar175;
          auVar38._24_4_ = uVar175;
          auVar38._28_4_ = uVar175;
          uVar33 = vcmpps_avx512vl(auVar142,auVar38,2);
          bVar115 = (byte)uVar188 & (byte)uVar33 & bVar115;
          if (bVar115 == 0) {
            bVar115 = 0;
            auVar220 = ZEXT3264(auVar126);
            auVar203 = ZEXT3264(auVar128);
          }
          else {
            uVar188 = vcmpps_avx512vl(auVar141,auVar123,4);
            if ((bVar115 & (byte)uVar188) == 0) {
              bVar115 = 0;
              auVar220 = ZEXT3264(auVar126);
              auVar203 = ZEXT3264(auVar128);
            }
            else {
              bVar115 = bVar115 & (byte)uVar188;
              fVar195 = auVar132._0_4_ * fVar205;
              fVar204 = auVar132._4_4_ * fVar174;
              auVar63._4_4_ = fVar204;
              auVar63._0_4_ = fVar195;
              fVar116 = auVar132._8_4_ * fVar211;
              auVar63._8_4_ = fVar116;
              fVar117 = auVar132._12_4_ * fVar212;
              auVar63._12_4_ = fVar117;
              fVar194 = auVar132._16_4_ * 0.0;
              auVar63._16_4_ = fVar194;
              fVar166 = auVar132._20_4_ * 0.0;
              auVar63._20_4_ = fVar166;
              fVar167 = auVar132._24_4_ * 0.0;
              auVar63._24_4_ = fVar167;
              auVar63._28_4_ = auVar132._28_4_;
              fVar205 = auVar133._0_4_ * fVar205;
              fVar174 = auVar133._4_4_ * fVar174;
              auVar64._4_4_ = fVar174;
              auVar64._0_4_ = fVar205;
              fVar211 = auVar133._8_4_ * fVar211;
              auVar64._8_4_ = fVar211;
              fVar212 = auVar133._12_4_ * fVar212;
              auVar64._12_4_ = fVar212;
              fVar168 = auVar133._16_4_ * 0.0;
              auVar64._16_4_ = fVar168;
              fVar170 = auVar133._20_4_ * 0.0;
              auVar64._20_4_ = fVar170;
              fVar171 = auVar133._24_4_ * 0.0;
              auVar64._24_4_ = fVar171;
              auVar64._28_4_ = auVar133._28_4_;
              auVar217._8_4_ = 0x3f800000;
              auVar217._0_8_ = &DAT_3f8000003f800000;
              auVar217._12_4_ = 0x3f800000;
              auVar217._16_4_ = 0x3f800000;
              auVar217._20_4_ = 0x3f800000;
              auVar217._24_4_ = 0x3f800000;
              auVar217._28_4_ = 0x3f800000;
              auVar128 = vsubps_avx(auVar217,auVar63);
              bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar106 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar106 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar106 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar106 >> 6) & 1);
              bVar23 = SUB81(uVar106 >> 7,0);
              auVar220 = ZEXT3264(CONCAT428((uint)bVar23 * auVar132._28_4_ |
                                            (uint)!bVar23 * auVar128._28_4_,
                                            CONCAT424((uint)bVar22 * (int)fVar167 |
                                                      (uint)!bVar22 * auVar128._24_4_,
                                                      CONCAT420((uint)bVar21 * (int)fVar166 |
                                                                (uint)!bVar21 * auVar128._20_4_,
                                                                CONCAT416((uint)bVar20 *
                                                                          (int)fVar194 |
                                                                          (uint)!bVar20 *
                                                                          auVar128._16_4_,
                                                                          CONCAT412((uint)bVar19 *
                                                                                    (int)fVar117 |
                                                                                    (uint)!bVar19 *
                                                                                    auVar128._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar18 * (int)fVar116 |
                                                  (uint)!bVar18 * auVar128._8_4_,
                                                  CONCAT44((uint)bVar17 * (int)fVar204 |
                                                           (uint)!bVar17 * auVar128._4_4_,
                                                           (uint)(bVar105 & 1) * (int)fVar195 |
                                                           (uint)!(bool)(bVar105 & 1) *
                                                           auVar128._0_4_))))))));
              auVar128 = vsubps_avx(auVar217,auVar64);
              local_5a0._0_4_ =
                   (uint)(bVar105 & 1) * (int)fVar205 | (uint)!(bool)(bVar105 & 1) * auVar128._0_4_;
              bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar128._4_4_;
              bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar17 * (int)fVar211 | (uint)!bVar17 * auVar128._8_4_;
              bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar17 * (int)fVar212 | (uint)!bVar17 * auVar128._12_4_;
              bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar17 * (int)fVar168 | (uint)!bVar17 * auVar128._16_4_;
              bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar17 * (int)fVar170 | (uint)!bVar17 * auVar128._20_4_;
              bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar128._24_4_;
              bVar17 = SUB81(uVar106 >> 7,0);
              local_5a0._28_4_ = (uint)bVar17 * auVar133._28_4_ | (uint)!bVar17 * auVar128._28_4_;
              auVar203 = ZEXT3264(auVar142);
            }
          }
        }
        auVar240 = ZEXT3264(local_8a0);
        auVar187 = ZEXT3264(local_880);
        if (bVar115 != 0) {
          auVar128 = vsubps_avx(ZEXT1632(auVar10),auVar136);
          auVar141 = auVar220._0_32_;
          auVar119 = vfmadd213ps_fma(auVar128,auVar141,auVar136);
          uVar175 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar39._4_4_ = uVar175;
          auVar39._0_4_ = uVar175;
          auVar39._8_4_ = uVar175;
          auVar39._12_4_ = uVar175;
          auVar39._16_4_ = uVar175;
          auVar39._20_4_ = uVar175;
          auVar39._24_4_ = uVar175;
          auVar39._28_4_ = uVar175;
          auVar128 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar119._12_4_ + auVar119._12_4_,
                                                        CONCAT48(auVar119._8_4_ + auVar119._8_4_,
                                                                 CONCAT44(auVar119._4_4_ +
                                                                          auVar119._4_4_,
                                                                          auVar119._0_4_ +
                                                                          auVar119._0_4_)))),auVar39
                                    );
          auVar126 = auVar203._0_32_;
          uVar188 = vcmpps_avx512vl(auVar126,auVar128,6);
          bVar115 = bVar115 & (byte)uVar188;
          if (bVar115 != 0) {
            auVar180._8_4_ = 0xbf800000;
            auVar180._0_8_ = 0xbf800000bf800000;
            auVar180._12_4_ = 0xbf800000;
            auVar180._16_4_ = 0xbf800000;
            auVar180._20_4_ = 0xbf800000;
            auVar180._24_4_ = 0xbf800000;
            auVar180._28_4_ = 0xbf800000;
            auVar40._8_4_ = 0x40000000;
            auVar40._0_8_ = 0x4000000040000000;
            auVar40._12_4_ = 0x40000000;
            auVar40._16_4_ = 0x40000000;
            auVar40._20_4_ = 0x40000000;
            auVar40._24_4_ = 0x40000000;
            auVar40._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5a0,auVar180,auVar40);
            local_5a0 = local_700;
            auVar128 = local_5a0;
            local_6c0 = 0;
            local_5a0 = auVar128;
            if ((pGVar111->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar205 = 1.0 / auVar228._0_4_;
              local_660[0] = fVar205 * (auVar220._0_4_ + 0.0);
              local_660[1] = fVar205 * (auVar220._4_4_ + 1.0);
              local_660[2] = fVar205 * (auVar220._8_4_ + 2.0);
              local_660[3] = fVar205 * (auVar220._12_4_ + 3.0);
              fStack_650 = fVar205 * (auVar220._16_4_ + 4.0);
              fStack_64c = fVar205 * (auVar220._20_4_ + 5.0);
              fStack_648 = fVar205 * (auVar220._24_4_ + 6.0);
              fStack_644 = auVar220._28_4_ + 7.0;
              local_5a0._0_8_ = local_700._0_8_;
              local_5a0._8_8_ = local_700._8_8_;
              local_5a0._16_8_ = local_700._16_8_;
              local_5a0._24_8_ = local_700._24_8_;
              local_640 = local_5a0._0_8_;
              uStack_638 = local_5a0._8_8_;
              uStack_630 = local_5a0._16_8_;
              uStack_628 = local_5a0._24_8_;
              local_620 = auVar126;
              auVar181._8_4_ = 0x7f800000;
              auVar181._0_8_ = 0x7f8000007f800000;
              auVar181._12_4_ = 0x7f800000;
              auVar181._16_4_ = 0x7f800000;
              auVar181._20_4_ = 0x7f800000;
              auVar181._24_4_ = 0x7f800000;
              auVar181._28_4_ = 0x7f800000;
              auVar128 = vblendmps_avx512vl(auVar181,auVar126);
              auVar153._0_4_ =
                   (uint)(bVar115 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar115 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar17 * auVar128._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar17 * auVar128._20_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar115 >> 6 & 1);
              auVar153._24_4_ = (uint)bVar17 * auVar128._24_4_ | (uint)!bVar17 * 0x7f800000;
              auVar153._28_4_ =
                   (uint)(bVar115 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar115 >> 7) * 0x7f800000
              ;
              auVar128 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar128 = vminps_avx(auVar153,auVar128);
              auVar142 = vshufpd_avx(auVar128,auVar128,5);
              auVar128 = vminps_avx(auVar128,auVar142);
              auVar142 = vpermpd_avx2(auVar128,0x4e);
              auVar128 = vminps_avx(auVar128,auVar142);
              uVar188 = vcmpps_avx512vl(auVar153,auVar128,0);
              bVar104 = (byte)uVar188 & bVar115;
              bVar105 = bVar115;
              if (bVar104 != 0) {
                bVar105 = bVar104;
              }
              uVar108 = 0;
              for (uVar107 = (uint)bVar105; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x80000000)
              {
                uVar108 = uVar108 + 1;
              }
              uVar106 = (ulong)uVar108;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar111->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar205 = local_660[uVar106];
                uVar175 = *(undefined4 *)((long)&local_640 + uVar106 * 4);
                fVar211 = 1.0 - fVar205;
                fVar174 = fVar211 * fVar211 * -3.0;
                auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),
                                           ZEXT416((uint)(fVar205 * fVar211)),ZEXT416(0xc0000000));
                auVar238 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar211)),
                                           ZEXT416((uint)(fVar205 * fVar205)),ZEXT416(0x40000000));
                fVar211 = auVar119._0_4_ * 3.0;
                fVar212 = auVar238._0_4_ * 3.0;
                fVar195 = fVar205 * fVar205 * 3.0;
                auVar213._0_4_ = fVar195 * local_8e0;
                auVar213._4_4_ = fVar195 * fStack_8dc;
                auVar213._8_4_ = fVar195 * fStack_8d8;
                auVar213._12_4_ = fVar195 * fStack_8d4;
                auVar190._4_4_ = fVar212;
                auVar190._0_4_ = fVar212;
                auVar190._8_4_ = fVar212;
                auVar190._12_4_ = fVar212;
                auVar119 = vfmadd132ps_fma(auVar190,auVar213,*pauVar4);
                auVar220 = ZEXT3264(auVar141);
                auVar197._4_4_ = fVar211;
                auVar197._0_4_ = fVar211;
                auVar197._8_4_ = fVar211;
                auVar197._12_4_ = fVar211;
                auVar119 = vfmadd132ps_fma(auVar197,auVar119,*pauVar3);
                auVar191._4_4_ = fVar174;
                auVar191._0_4_ = fVar174;
                auVar191._8_4_ = fVar174;
                auVar191._12_4_ = fVar174;
                auVar119 = vfmadd213ps_fma(auVar191,auVar31,auVar119);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar106 * 4);
                auVar203 = ZEXT3264(auVar126);
                *(int *)(ray + k * 4 + 0x300) = auVar119._0_4_;
                uVar15 = vextractps_avx(auVar119,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                uVar15 = vextractps_avx(auVar119,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                *(float *)(ray + k * 4 + 0x3c0) = fVar205;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar175;
                *(uint *)(ray + k * 4 + 0x440) = uVar13;
                *(uint *)(ray + k * 4 + 0x480) = uVar112;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar203 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar203);
                auVar203 = vpbroadcastd_avx512f();
                local_540 = vmovdqa64_avx512f(auVar203);
                local_800 = (undefined4)uVar32;
                uStack_7fc = (undefined4)((ulong)uVar32 >> 0x20);
                local_820 = local_8e0;
                fStack_81c = fStack_8dc;
                fStack_818 = fStack_8d8;
                fStack_814 = fStack_8d4;
                local_810 = uVar97;
                uStack_808 = uVar98;
                uStack_7f8 = uVar34;
                local_720 = auVar141;
                local_6e0 = auVar126;
                local_6bc = iVar14;
                local_6b0 = auVar31;
                local_6a0 = uVar32;
                uStack_698 = uVar34;
                local_690 = uVar97;
                uStack_688 = uVar98;
                local_670 = bVar115;
                do {
                  auVar238 = auVar239._0_16_;
                  local_4c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar106]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar106 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar106 * 4);
                  local_910.context = context->user;
                  fVar212 = local_200._0_4_;
                  fVar174 = 1.0 - fVar212;
                  fVar205 = fVar174 * fVar174 * -3.0;
                  auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                             ZEXT416((uint)(fVar212 * fVar174)),ZEXT416(0xc0000000))
                  ;
                  auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar212 * fVar174)),
                                             ZEXT416((uint)(fVar212 * fVar212)),ZEXT416(0x40000000))
                  ;
                  fVar174 = auVar120._0_4_ * 3.0;
                  fVar211 = auVar119._0_4_ * 3.0;
                  fVar212 = fVar212 * fVar212 * 3.0;
                  auVar216._0_4_ = fVar212 * local_820;
                  auVar216._4_4_ = fVar212 * fStack_81c;
                  auVar216._8_4_ = fVar212 * fStack_818;
                  auVar216._12_4_ = fVar212 * fStack_814;
                  auVar178._4_4_ = fVar211;
                  auVar178._0_4_ = fVar211;
                  auVar178._8_4_ = fVar211;
                  auVar178._12_4_ = fVar211;
                  auVar101._8_8_ = uStack_808;
                  auVar101._0_8_ = local_810;
                  auVar120 = vfmadd132ps_fma(auVar178,auVar216,auVar101);
                  auVar200._4_4_ = fVar174;
                  auVar200._0_4_ = fVar174;
                  auVar200._8_4_ = fVar174;
                  auVar200._12_4_ = fVar174;
                  auVar102._4_4_ = uStack_7fc;
                  auVar102._0_4_ = local_800;
                  auVar102._8_8_ = uStack_7f8;
                  auVar120 = vfmadd132ps_fma(auVar200,auVar120,auVar102);
                  auVar179._4_4_ = fVar205;
                  auVar179._0_4_ = fVar205;
                  auVar179._8_4_ = fVar205;
                  auVar179._12_4_ = fVar205;
                  auVar120 = vfmadd213ps_fma(auVar179,auVar31,auVar120);
                  auVar203 = vbroadcastss_avx512f(auVar120);
                  auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar220,ZEXT1664(auVar120));
                  auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar120));
                  local_2c0[0] = (RTCHitN)auVar203[0];
                  local_2c0[1] = (RTCHitN)auVar203[1];
                  local_2c0[2] = (RTCHitN)auVar203[2];
                  local_2c0[3] = (RTCHitN)auVar203[3];
                  local_2c0[4] = (RTCHitN)auVar203[4];
                  local_2c0[5] = (RTCHitN)auVar203[5];
                  local_2c0[6] = (RTCHitN)auVar203[6];
                  local_2c0[7] = (RTCHitN)auVar203[7];
                  local_2c0[8] = (RTCHitN)auVar203[8];
                  local_2c0[9] = (RTCHitN)auVar203[9];
                  local_2c0[10] = (RTCHitN)auVar203[10];
                  local_2c0[0xb] = (RTCHitN)auVar203[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar203[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar203[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar203[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar203[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar203[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar203[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar203[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar203[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar203[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar203[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar203[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar203[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar203[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar203[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar203[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar203[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar203[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar203[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar203[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar203[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar203[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar203[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar203[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar203[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar203[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar203[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar203[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar203[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar203[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar203[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar203[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar203[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar203[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar203[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar203[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar203[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar203[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar203[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar203[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar203[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar203[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar203[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar203[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar203[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar203[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar203[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar203[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar203[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar203[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar203[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar203[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar203[0x3f];
                  local_180 = local_540._0_8_;
                  uStack_178 = local_540._8_8_;
                  uStack_170 = local_540._16_8_;
                  uStack_168 = local_540._24_8_;
                  uStack_160 = local_540._32_8_;
                  uStack_158 = local_540._40_8_;
                  uStack_150 = local_540._48_8_;
                  uStack_148 = local_540._56_8_;
                  auVar203 = vmovdqa64_avx512f(local_500);
                  local_140 = vmovdqa64_avx512f(auVar203);
                  auVar128 = vpcmpeqd_avx2(auVar203._0_32_,auVar203._0_32_);
                  local_8c8[3] = auVar128;
                  local_8c8[2] = auVar128;
                  local_8c8[1] = auVar128;
                  *local_8c8 = auVar128;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_910.valid = (int *)local_600;
                  local_910.geometryUserPtr = pGVar111->userPtr;
                  local_910.hit = local_2c0;
                  local_910.N = 0x10;
                  local_760 = (uint)uVar106;
                  uStack_75c = (uint)(uVar106 >> 0x20);
                  local_910.ray = (RTCRayN *)ray;
                  if (pGVar111->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar111->intersectionFilterN)(&local_910);
                    uVar106 = CONCAT44(uStack_75c,local_760);
                    auVar237 = ZEXT1664(local_780._0_16_);
                    auVar240 = ZEXT3264(local_8a0);
                    auVar187 = ZEXT3264(local_880);
                    auVar234 = ZEXT3264(local_8c0);
                    auVar235 = ZEXT3264(local_7c0);
                    auVar236 = ZEXT3264(local_7a0);
                    in_ZMM21 = ZEXT3264(local_860);
                    in_ZMM20 = ZEXT3264(local_840);
                    auVar120 = vxorps_avx512vl(auVar238,auVar238);
                    auVar239 = ZEXT1664(auVar120);
                    uVar110 = local_7e0._0_4_;
                  }
                  auVar120 = auVar239._0_16_;
                  auVar203 = vmovdqa64_avx512f(local_600);
                  uVar188 = vptestmd_avx512f(auVar203,auVar203);
                  if ((short)uVar188 == 0) {
LAB_01e00ba3:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_4c0._0_4_;
                  }
                  else {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar111->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_910);
                      uVar106 = CONCAT44(uStack_75c,local_760);
                      auVar237 = ZEXT1664(local_780._0_16_);
                      auVar240 = ZEXT3264(local_8a0);
                      auVar187 = ZEXT3264(local_880);
                      auVar234 = ZEXT3264(local_8c0);
                      auVar235 = ZEXT3264(local_7c0);
                      auVar236 = ZEXT3264(local_7a0);
                      in_ZMM21 = ZEXT3264(local_860);
                      in_ZMM20 = ZEXT3264(local_840);
                      auVar120 = vxorps_avx512vl(auVar120,auVar120);
                      auVar239 = ZEXT1664(auVar120);
                      uVar110 = local_7e0._0_4_;
                    }
                    auVar203 = vmovdqa64_avx512f(local_600);
                    uVar109 = vptestmd_avx512f(auVar203,auVar203);
                    if ((short)uVar109 == 0) goto LAB_01e00ba3;
                    iVar1 = *(int *)(local_910.hit + 4);
                    iVar2 = *(int *)(local_910.hit + 8);
                    iVar84 = *(int *)(local_910.hit + 0xc);
                    iVar85 = *(int *)(local_910.hit + 0x10);
                    iVar86 = *(int *)(local_910.hit + 0x14);
                    iVar87 = *(int *)(local_910.hit + 0x18);
                    iVar88 = *(int *)(local_910.hit + 0x1c);
                    iVar89 = *(int *)(local_910.hit + 0x20);
                    iVar90 = *(int *)(local_910.hit + 0x24);
                    iVar91 = *(int *)(local_910.hit + 0x28);
                    iVar92 = *(int *)(local_910.hit + 0x2c);
                    iVar93 = *(int *)(local_910.hit + 0x30);
                    iVar94 = *(int *)(local_910.hit + 0x34);
                    iVar95 = *(int *)(local_910.hit + 0x38);
                    iVar96 = *(int *)(local_910.hit + 0x3c);
                    bVar105 = (byte)uVar109;
                    bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                    bVar104 = (byte)(uVar109 >> 8);
                    bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                    bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                    bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                    bVar30 = SUB81(uVar109 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x300) =
                         (uint)(bVar105 & 1) * *(int *)local_910.hit |
                         (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x300);
                    *(uint *)(local_910.ray + 0x304) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x304);
                    *(uint *)(local_910.ray + 0x308) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x308);
                    *(uint *)(local_910.ray + 0x30c) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x30c);
                    *(uint *)(local_910.ray + 0x310) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x310);
                    *(uint *)(local_910.ray + 0x314) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x314);
                    *(uint *)(local_910.ray + 0x318) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x318);
                    *(uint *)(local_910.ray + 0x31c) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x31c);
                    *(uint *)(local_910.ray + 800) =
                         (uint)(bVar104 & 1) * iVar89 |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 800);
                    *(uint *)(local_910.ray + 0x324) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x324);
                    *(uint *)(local_910.ray + 0x328) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x328);
                    *(uint *)(local_910.ray + 0x32c) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x32c);
                    *(uint *)(local_910.ray + 0x330) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x330);
                    *(uint *)(local_910.ray + 0x334) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x334);
                    *(uint *)(local_910.ray + 0x338) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x338);
                    *(uint *)(local_910.ray + 0x33c) =
                         (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x33c);
                    iVar1 = *(int *)(local_910.hit + 0x44);
                    iVar2 = *(int *)(local_910.hit + 0x48);
                    iVar84 = *(int *)(local_910.hit + 0x4c);
                    iVar85 = *(int *)(local_910.hit + 0x50);
                    iVar86 = *(int *)(local_910.hit + 0x54);
                    iVar87 = *(int *)(local_910.hit + 0x58);
                    iVar88 = *(int *)(local_910.hit + 0x5c);
                    iVar89 = *(int *)(local_910.hit + 0x60);
                    iVar90 = *(int *)(local_910.hit + 100);
                    iVar91 = *(int *)(local_910.hit + 0x68);
                    iVar92 = *(int *)(local_910.hit + 0x6c);
                    iVar93 = *(int *)(local_910.hit + 0x70);
                    iVar94 = *(int *)(local_910.hit + 0x74);
                    iVar95 = *(int *)(local_910.hit + 0x78);
                    iVar96 = *(int *)(local_910.hit + 0x7c);
                    bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                    bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                    bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                    bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                    bVar30 = SUB81(uVar109 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x340) =
                         (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x40) |
                         (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x340);
                    *(uint *)(local_910.ray + 0x344) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x344);
                    *(uint *)(local_910.ray + 0x348) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x348);
                    *(uint *)(local_910.ray + 0x34c) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x34c);
                    *(uint *)(local_910.ray + 0x350) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x350);
                    *(uint *)(local_910.ray + 0x354) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x354);
                    *(uint *)(local_910.ray + 0x358) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x358);
                    *(uint *)(local_910.ray + 0x35c) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x35c);
                    *(uint *)(local_910.ray + 0x360) =
                         (uint)(bVar104 & 1) * iVar89 |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x360);
                    *(uint *)(local_910.ray + 0x364) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x364);
                    *(uint *)(local_910.ray + 0x368) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x368);
                    *(uint *)(local_910.ray + 0x36c) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x36c);
                    *(uint *)(local_910.ray + 0x370) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x370);
                    *(uint *)(local_910.ray + 0x374) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x374);
                    *(uint *)(local_910.ray + 0x378) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x378);
                    *(uint *)(local_910.ray + 0x37c) =
                         (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x37c);
                    iVar1 = *(int *)(local_910.hit + 0x84);
                    iVar2 = *(int *)(local_910.hit + 0x88);
                    iVar84 = *(int *)(local_910.hit + 0x8c);
                    iVar85 = *(int *)(local_910.hit + 0x90);
                    iVar86 = *(int *)(local_910.hit + 0x94);
                    iVar87 = *(int *)(local_910.hit + 0x98);
                    iVar88 = *(int *)(local_910.hit + 0x9c);
                    iVar89 = *(int *)(local_910.hit + 0xa0);
                    iVar90 = *(int *)(local_910.hit + 0xa4);
                    iVar91 = *(int *)(local_910.hit + 0xa8);
                    iVar92 = *(int *)(local_910.hit + 0xac);
                    iVar93 = *(int *)(local_910.hit + 0xb0);
                    iVar94 = *(int *)(local_910.hit + 0xb4);
                    iVar95 = *(int *)(local_910.hit + 0xb8);
                    iVar96 = *(int *)(local_910.hit + 0xbc);
                    bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                    bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                    bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                    bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                    bVar30 = SUB81(uVar109 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x380) =
                         (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x80) |
                         (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x380);
                    *(uint *)(local_910.ray + 900) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 900);
                    *(uint *)(local_910.ray + 0x388) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x388);
                    *(uint *)(local_910.ray + 0x38c) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x38c);
                    *(uint *)(local_910.ray + 0x390) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x390);
                    *(uint *)(local_910.ray + 0x394) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x394);
                    *(uint *)(local_910.ray + 0x398) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x398);
                    *(uint *)(local_910.ray + 0x39c) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x39c);
                    *(uint *)(local_910.ray + 0x3a0) =
                         (uint)(bVar104 & 1) * iVar89 |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3a0);
                    *(uint *)(local_910.ray + 0x3a4) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3a4);
                    *(uint *)(local_910.ray + 0x3a8) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3a8);
                    *(uint *)(local_910.ray + 0x3ac) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3ac);
                    *(uint *)(local_910.ray + 0x3b0) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3b0);
                    *(uint *)(local_910.ray + 0x3b4) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3b4);
                    *(uint *)(local_910.ray + 0x3b8) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3b8);
                    *(uint *)(local_910.ray + 0x3bc) =
                         (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x3bc);
                    iVar1 = *(int *)(local_910.hit + 0xc4);
                    iVar2 = *(int *)(local_910.hit + 200);
                    iVar84 = *(int *)(local_910.hit + 0xcc);
                    iVar85 = *(int *)(local_910.hit + 0xd0);
                    iVar86 = *(int *)(local_910.hit + 0xd4);
                    iVar87 = *(int *)(local_910.hit + 0xd8);
                    iVar88 = *(int *)(local_910.hit + 0xdc);
                    iVar89 = *(int *)(local_910.hit + 0xe0);
                    iVar90 = *(int *)(local_910.hit + 0xe4);
                    iVar91 = *(int *)(local_910.hit + 0xe8);
                    iVar92 = *(int *)(local_910.hit + 0xec);
                    iVar93 = *(int *)(local_910.hit + 0xf0);
                    iVar94 = *(int *)(local_910.hit + 0xf4);
                    iVar95 = *(int *)(local_910.hit + 0xf8);
                    iVar96 = *(int *)(local_910.hit + 0xfc);
                    bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                    bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                    bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                    bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                    bVar30 = SUB81(uVar109 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x3c0) =
                         (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0xc0) |
                         (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x3c0);
                    *(uint *)(local_910.ray + 0x3c4) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x3c4);
                    *(uint *)(local_910.ray + 0x3c8) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x3c8);
                    *(uint *)(local_910.ray + 0x3cc) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x3cc);
                    *(uint *)(local_910.ray + 0x3d0) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x3d0);
                    *(uint *)(local_910.ray + 0x3d4) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x3d4);
                    *(uint *)(local_910.ray + 0x3d8) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x3d8);
                    *(uint *)(local_910.ray + 0x3dc) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3dc);
                    *(uint *)(local_910.ray + 0x3e0) =
                         (uint)(bVar104 & 1) * iVar89 |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3e0);
                    *(uint *)(local_910.ray + 0x3e4) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3e4);
                    *(uint *)(local_910.ray + 1000) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 1000);
                    *(uint *)(local_910.ray + 0x3ec) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3ec);
                    *(uint *)(local_910.ray + 0x3f0) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3f0);
                    *(uint *)(local_910.ray + 0x3f4) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3f4);
                    *(uint *)(local_910.ray + 0x3f8) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3f8);
                    *(uint *)(local_910.ray + 0x3fc) =
                         (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x3fc);
                    iVar1 = *(int *)(local_910.hit + 0x104);
                    iVar2 = *(int *)(local_910.hit + 0x108);
                    iVar84 = *(int *)(local_910.hit + 0x10c);
                    iVar85 = *(int *)(local_910.hit + 0x110);
                    iVar86 = *(int *)(local_910.hit + 0x114);
                    iVar87 = *(int *)(local_910.hit + 0x118);
                    iVar88 = *(int *)(local_910.hit + 0x11c);
                    iVar89 = *(int *)(local_910.hit + 0x120);
                    iVar90 = *(int *)(local_910.hit + 0x124);
                    iVar91 = *(int *)(local_910.hit + 0x128);
                    iVar92 = *(int *)(local_910.hit + 300);
                    iVar93 = *(int *)(local_910.hit + 0x130);
                    iVar94 = *(int *)(local_910.hit + 0x134);
                    iVar95 = *(int *)(local_910.hit + 0x138);
                    iVar96 = *(int *)(local_910.hit + 0x13c);
                    bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                    bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                    bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                    bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                    bVar30 = SUB81(uVar109 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x400) =
                         (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x100) |
                         (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x400);
                    *(uint *)(local_910.ray + 0x404) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x404);
                    *(uint *)(local_910.ray + 0x408) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x408);
                    *(uint *)(local_910.ray + 0x40c) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x40c);
                    *(uint *)(local_910.ray + 0x410) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x410);
                    *(uint *)(local_910.ray + 0x414) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x414);
                    *(uint *)(local_910.ray + 0x418) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x418);
                    *(uint *)(local_910.ray + 0x41c) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x41c);
                    *(uint *)(local_910.ray + 0x420) =
                         (uint)(bVar104 & 1) * iVar89 |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x420);
                    *(uint *)(local_910.ray + 0x424) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x424);
                    *(uint *)(local_910.ray + 0x428) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x428);
                    *(uint *)(local_910.ray + 0x42c) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x42c);
                    *(uint *)(local_910.ray + 0x430) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x430);
                    *(uint *)(local_910.ray + 0x434) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x434);
                    *(uint *)(local_910.ray + 0x438) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x438);
                    *(uint *)(local_910.ray + 0x43c) =
                         (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x43c);
                    auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x140));
                    auVar203 = vmovdqu32_avx512f(auVar203);
                    *(undefined1 (*) [64])(local_910.ray + 0x440) = auVar203;
                    auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x180));
                    auVar203 = vmovdqu32_avx512f(auVar203);
                    *(undefined1 (*) [64])(local_910.ray + 0x480) = auVar203;
                    auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x1c0));
                    auVar203 = vmovdqa32_avx512f(auVar203);
                    *(undefined1 (*) [64])(local_910.ray + 0x4c0) = auVar203;
                    auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x200));
                    auVar203 = vmovdqa32_avx512f(auVar203);
                    *(undefined1 (*) [64])(local_910.ray + 0x500) = auVar203;
                  }
                  auVar220 = ZEXT3264(auVar141);
                  auVar203 = ZEXT3264(auVar126);
                  auVar120 = auVar237._0_16_;
                  bVar105 = ~(byte)(1 << ((uint)uVar106 & 0x1f)) & bVar115;
                  uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar47._4_4_ = uVar175;
                  auVar47._0_4_ = uVar175;
                  auVar47._8_4_ = uVar175;
                  auVar47._12_4_ = uVar175;
                  auVar47._16_4_ = uVar175;
                  auVar47._20_4_ = uVar175;
                  auVar47._24_4_ = uVar175;
                  auVar47._28_4_ = uVar175;
                  uVar188 = vcmpps_avx512vl(auVar126,auVar47,2);
                  bVar115 = bVar105 & (byte)uVar188;
                  if ((bVar105 & (byte)uVar188) != 0) {
                    auVar186._8_4_ = 0x7f800000;
                    auVar186._0_8_ = 0x7f8000007f800000;
                    auVar186._12_4_ = 0x7f800000;
                    auVar186._16_4_ = 0x7f800000;
                    auVar186._20_4_ = 0x7f800000;
                    auVar186._24_4_ = 0x7f800000;
                    auVar186._28_4_ = 0x7f800000;
                    auVar128 = vblendmps_avx512vl(auVar186,auVar126);
                    auVar165._0_4_ =
                         (uint)(bVar115 & 1) * auVar128._0_4_ |
                         (uint)!(bool)(bVar115 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 1 & 1);
                    auVar165._4_4_ = (uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 2 & 1);
                    auVar165._8_4_ = (uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 3 & 1);
                    auVar165._12_4_ = (uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 4 & 1);
                    auVar165._16_4_ = (uint)bVar17 * auVar128._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 5 & 1);
                    auVar165._20_4_ = (uint)bVar17 * auVar128._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar115 >> 6 & 1);
                    auVar165._24_4_ = (uint)bVar17 * auVar128._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar165._28_4_ =
                         (uint)(bVar115 >> 7) * auVar128._28_4_ |
                         (uint)!(bool)(bVar115 >> 7) * 0x7f800000;
                    auVar128 = vshufps_avx(auVar165,auVar165,0xb1);
                    auVar128 = vminps_avx(auVar165,auVar128);
                    auVar142 = vshufpd_avx(auVar128,auVar128,5);
                    auVar128 = vminps_avx(auVar128,auVar142);
                    auVar142 = vpermpd_avx2(auVar128,0x4e);
                    auVar128 = vminps_avx(auVar128,auVar142);
                    uVar188 = vcmpps_avx512vl(auVar165,auVar128,0);
                    bVar104 = (byte)uVar188 & bVar115;
                    bVar105 = bVar115;
                    if (bVar104 != 0) {
                      bVar105 = bVar104;
                    }
                    uVar108 = 0;
                    for (uVar107 = (uint)bVar105; (uVar107 & 1) == 0;
                        uVar107 = uVar107 >> 1 | 0x80000000) {
                      uVar108 = uVar108 + 1;
                    }
                    uVar106 = (ulong)uVar108;
                  }
                } while (bVar115 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar14) {
        local_780 = vpbroadcastd_avx512vl();
        local_7e0 = vbroadcastss_avx512vl(auVar120);
        fStack_730 = 1.0 / local_740;
        auStack_73c._0_4_ = fStack_730;
        local_740 = fStack_730;
        auStack_73c._4_4_ = fStack_730;
        fStack_734 = fStack_730;
        auVar237 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar237);
        auVar237 = vpbroadcastd_avx512f();
        local_500 = vmovdqa64_avx512f(auVar237);
        lVar114 = 8;
        auVar126 = auVar220._0_32_;
        auVar128 = auVar203._0_32_;
        local_760 = uVar110;
        uStack_75c = uVar110;
        uStack_758 = uVar110;
        uStack_754 = uVar110;
        uStack_750 = uVar110;
        uStack_74c = uVar110;
        uStack_748 = uVar110;
        uStack_744 = uVar110;
        fStack_72c = fStack_730;
        fStack_728 = fStack_730;
        fStack_724 = fStack_730;
        do {
          auVar141 = vpbroadcastd_avx512vl();
          auVar129 = vpor_avx2(auVar141,_DAT_0205a920);
          uVar33 = vpcmpd_avx512vl(auVar129,local_780,1);
          auVar141 = *(undefined1 (*) [32])(bezier_basis0 + lVar114 * 4 + lVar35);
          auVar142 = *(undefined1 (*) [32])(lVar35 + 0x2227768 + lVar114 * 4);
          auVar140 = *(undefined1 (*) [32])(lVar35 + 0x2227bec + lVar114 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar35 + 0x2228070 + lVar114 * 4);
          local_880 = auVar187._0_32_;
          auVar130 = vmulps_avx512vl(local_880,auVar127);
          local_8a0 = auVar240._0_32_;
          auVar131 = vmulps_avx512vl(local_8a0,auVar127);
          auVar65._4_4_ = auVar127._4_4_ * (float)local_3e0._4_4_;
          auVar65._0_4_ = auVar127._0_4_ * (float)local_3e0._0_4_;
          auVar65._8_4_ = auVar127._8_4_ * fStack_3d8;
          auVar65._12_4_ = auVar127._12_4_ * fStack_3d4;
          auVar65._16_4_ = auVar127._16_4_ * fStack_3d0;
          auVar65._20_4_ = auVar127._20_4_ * fStack_3cc;
          auVar65._24_4_ = auVar127._24_4_ * fStack_3c8;
          auVar65._28_4_ = auVar129._28_4_;
          auVar129 = vfmadd231ps_avx512vl(auVar130,auVar140,local_380);
          auVar130 = vfmadd231ps_avx512vl(auVar131,auVar140,local_3a0);
          auVar131 = vfmadd231ps_avx512vl(auVar65,auVar140,local_3c0);
          auVar138 = auVar234._0_32_;
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar142,auVar138);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar142,local_560);
          auVar120 = vfmadd231ps_fma(auVar131,auVar142,local_360);
          auVar222 = auVar236._0_32_;
          auVar133 = vfmadd231ps_avx512vl(auVar129,auVar141,auVar222);
          auVar219 = auVar235._0_32_;
          auVar123 = vfmadd231ps_avx512vl(auVar130,auVar141,auVar219);
          auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar114 * 4 + lVar35);
          auVar130 = *(undefined1 (*) [32])(lVar35 + 0x2229b88 + lVar114 * 4);
          auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar141,local_340);
          auVar131 = *(undefined1 (*) [32])(lVar35 + 0x222a00c + lVar114 * 4);
          auVar139 = *(undefined1 (*) [32])(lVar35 + 0x222a490 + lVar114 * 4);
          auVar125 = vmulps_avx512vl(local_880,auVar139);
          auVar132 = vmulps_avx512vl(local_8a0,auVar139);
          auVar66._4_4_ = auVar139._4_4_ * (float)local_3e0._4_4_;
          auVar66._0_4_ = auVar139._0_4_ * (float)local_3e0._0_4_;
          auVar66._8_4_ = auVar139._8_4_ * fStack_3d8;
          auVar66._12_4_ = auVar139._12_4_ * fStack_3d4;
          auVar66._16_4_ = auVar139._16_4_ * fStack_3d0;
          auVar66._20_4_ = auVar139._20_4_ * fStack_3cc;
          auVar66._24_4_ = auVar139._24_4_ * fStack_3c8;
          auVar66._28_4_ = uStack_3c4;
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar131,local_380);
          auVar132 = vfmadd231ps_avx512vl(auVar132,auVar131,local_3a0);
          auVar124 = vfmadd231ps_avx512vl(auVar66,auVar131,local_3c0);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,auVar138);
          auVar132 = vfmadd231ps_avx512vl(auVar132,auVar130,local_560);
          auVar119 = vfmadd231ps_fma(auVar124,auVar130,local_360);
          auVar124 = vfmadd231ps_avx512vl(auVar125,auVar129,auVar222);
          auVar134 = vfmadd231ps_avx512vl(auVar132,auVar129,auVar219);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar129,local_340);
          auVar135 = vmaxps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar119));
          auVar125 = vsubps_avx(auVar124,auVar133);
          auVar132 = vsubps_avx(auVar134,auVar123);
          auVar136 = vmulps_avx512vl(auVar123,auVar125);
          auVar137 = vmulps_avx512vl(auVar133,auVar132);
          auVar136 = vsubps_avx512vl(auVar136,auVar137);
          auVar137 = vmulps_avx512vl(auVar132,auVar132);
          auVar137 = vfmadd231ps_avx512vl(auVar137,auVar125,auVar125);
          auVar135 = vmulps_avx512vl(auVar135,auVar135);
          auVar135 = vmulps_avx512vl(auVar135,auVar137);
          auVar136 = vmulps_avx512vl(auVar136,auVar136);
          uVar188 = vcmpps_avx512vl(auVar136,auVar135,2);
          local_670 = (byte)uVar33 & (byte)uVar188;
          if (local_670 == 0) {
            auVar237 = ZEXT3264(auVar219);
            auVar234 = ZEXT3264(auVar138);
          }
          else {
            auVar139 = vmulps_avx512vl(local_460,auVar139);
            auVar131 = vfmadd213ps_avx512vl(auVar131,local_440,auVar139);
            auVar130 = vfmadd213ps_avx512vl(auVar130,local_420,auVar131);
            auVar129 = vfmadd213ps_avx512vl(auVar129,local_400,auVar130);
            auVar127 = vmulps_avx512vl(local_460,auVar127);
            auVar140 = vfmadd213ps_avx512vl(auVar140,local_440,auVar127);
            auVar142 = vfmadd213ps_avx512vl(auVar142,local_420,auVar140);
            auVar130 = vfmadd213ps_avx512vl(auVar141,local_400,auVar142);
            auVar141 = *(undefined1 (*) [32])(lVar35 + 0x22284f4 + lVar114 * 4);
            auVar142 = *(undefined1 (*) [32])(lVar35 + 0x2228978 + lVar114 * 4);
            auVar140 = *(undefined1 (*) [32])(lVar35 + 0x2228dfc + lVar114 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar35 + 0x2229280 + lVar114 * 4);
            auVar131 = vmulps_avx512vl(local_880,auVar127);
            auVar139 = vmulps_avx512vl(local_8a0,auVar127);
            auVar127 = vmulps_avx512vl(local_460,auVar127);
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar140,local_380);
            auVar139 = vfmadd231ps_avx512vl(auVar139,auVar140,local_3a0);
            auVar140 = vfmadd231ps_avx512vl(auVar127,local_440,auVar140);
            auVar127 = vfmadd231ps_avx512vl(auVar131,auVar142,auVar138);
            auVar131 = vfmadd231ps_avx512vl(auVar139,auVar142,local_560);
            auVar142 = vfmadd231ps_avx512vl(auVar140,local_420,auVar142);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar141,auVar222);
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar141,auVar219);
            auVar139 = vfmadd231ps_avx512vl(auVar142,local_400,auVar141);
            auVar141 = *(undefined1 (*) [32])(lVar35 + 0x222a914 + lVar114 * 4);
            auVar142 = *(undefined1 (*) [32])(lVar35 + 0x222b21c + lVar114 * 4);
            auVar140 = *(undefined1 (*) [32])(lVar35 + 0x222b6a0 + lVar114 * 4);
            auVar135 = vmulps_avx512vl(local_880,auVar140);
            auVar136 = vmulps_avx512vl(local_8a0,auVar140);
            auVar140 = vmulps_avx512vl(local_460,auVar140);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar142,local_380);
            auVar136 = vfmadd231ps_avx512vl(auVar136,auVar142,local_3a0);
            auVar140 = vfmadd231ps_avx512vl(auVar140,local_440,auVar142);
            auVar142 = *(undefined1 (*) [32])(lVar35 + 0x222ad98 + lVar114 * 4);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar142,auVar138);
            auVar238 = vfmadd231ps_fma(auVar136,auVar142,local_560);
            auVar142 = vfmadd231ps_avx512vl(auVar140,local_420,auVar142);
            auVar140 = vfmadd231ps_avx512vl(auVar135,auVar141,auVar222);
            auVar135 = vfmadd231ps_avx512vl(ZEXT1632(auVar238),auVar141,auVar219);
            auVar142 = vfmadd231ps_avx512vl(auVar142,local_400,auVar141);
            auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar127,auVar136);
            vandps_avx512vl(auVar131,auVar136);
            auVar141 = vmaxps_avx(auVar136,auVar136);
            vandps_avx512vl(auVar139,auVar136);
            auVar141 = vmaxps_avx(auVar141,auVar136);
            uVar106 = vcmpps_avx512vl(auVar141,local_7e0,1);
            bVar17 = (bool)((byte)uVar106 & 1);
            auVar154._0_4_ = (float)((uint)bVar17 * auVar125._0_4_ | (uint)!bVar17 * auVar127._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar154._4_4_ = (float)((uint)bVar17 * auVar125._4_4_ | (uint)!bVar17 * auVar127._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar154._8_4_ = (float)((uint)bVar17 * auVar125._8_4_ | (uint)!bVar17 * auVar127._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar154._12_4_ =
                 (float)((uint)bVar17 * auVar125._12_4_ | (uint)!bVar17 * auVar127._12_4_);
            bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
            auVar154._16_4_ =
                 (float)((uint)bVar17 * auVar125._16_4_ | (uint)!bVar17 * auVar127._16_4_);
            bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
            auVar154._20_4_ =
                 (float)((uint)bVar17 * auVar125._20_4_ | (uint)!bVar17 * auVar127._20_4_);
            bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
            auVar154._24_4_ =
                 (float)((uint)bVar17 * auVar125._24_4_ | (uint)!bVar17 * auVar127._24_4_);
            bVar17 = SUB81(uVar106 >> 7,0);
            auVar154._28_4_ = (uint)bVar17 * auVar125._28_4_ | (uint)!bVar17 * auVar127._28_4_;
            bVar17 = (bool)((byte)uVar106 & 1);
            auVar155._0_4_ = (float)((uint)bVar17 * auVar132._0_4_ | (uint)!bVar17 * auVar131._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar155._4_4_ = (float)((uint)bVar17 * auVar132._4_4_ | (uint)!bVar17 * auVar131._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar155._8_4_ = (float)((uint)bVar17 * auVar132._8_4_ | (uint)!bVar17 * auVar131._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar155._12_4_ =
                 (float)((uint)bVar17 * auVar132._12_4_ | (uint)!bVar17 * auVar131._12_4_);
            bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
            auVar155._16_4_ =
                 (float)((uint)bVar17 * auVar132._16_4_ | (uint)!bVar17 * auVar131._16_4_);
            bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
            auVar155._20_4_ =
                 (float)((uint)bVar17 * auVar132._20_4_ | (uint)!bVar17 * auVar131._20_4_);
            bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
            auVar155._24_4_ =
                 (float)((uint)bVar17 * auVar132._24_4_ | (uint)!bVar17 * auVar131._24_4_);
            bVar17 = SUB81(uVar106 >> 7,0);
            auVar155._28_4_ = (uint)bVar17 * auVar132._28_4_ | (uint)!bVar17 * auVar131._28_4_;
            vandps_avx512vl(auVar140,auVar136);
            vandps_avx512vl(auVar135,auVar136);
            auVar141 = vmaxps_avx(auVar155,auVar155);
            vandps_avx512vl(auVar142,auVar136);
            auVar141 = vmaxps_avx(auVar141,auVar155);
            uVar106 = vcmpps_avx512vl(auVar141,local_7e0,1);
            bVar17 = (bool)((byte)uVar106 & 1);
            auVar156._0_4_ = (uint)bVar17 * auVar125._0_4_ | (uint)!bVar17 * auVar140._0_4_;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar156._4_4_ = (uint)bVar17 * auVar125._4_4_ | (uint)!bVar17 * auVar140._4_4_;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar156._8_4_ = (uint)bVar17 * auVar125._8_4_ | (uint)!bVar17 * auVar140._8_4_;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar156._12_4_ = (uint)bVar17 * auVar125._12_4_ | (uint)!bVar17 * auVar140._12_4_;
            bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
            auVar156._16_4_ = (uint)bVar17 * auVar125._16_4_ | (uint)!bVar17 * auVar140._16_4_;
            bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
            auVar156._20_4_ = (uint)bVar17 * auVar125._20_4_ | (uint)!bVar17 * auVar140._20_4_;
            bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
            auVar156._24_4_ = (uint)bVar17 * auVar125._24_4_ | (uint)!bVar17 * auVar140._24_4_;
            bVar17 = SUB81(uVar106 >> 7,0);
            auVar156._28_4_ = (uint)bVar17 * auVar125._28_4_ | (uint)!bVar17 * auVar140._28_4_;
            bVar17 = (bool)((byte)uVar106 & 1);
            auVar157._0_4_ = (float)((uint)bVar17 * auVar132._0_4_ | (uint)!bVar17 * auVar135._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar157._4_4_ = (float)((uint)bVar17 * auVar132._4_4_ | (uint)!bVar17 * auVar135._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar157._8_4_ = (float)((uint)bVar17 * auVar132._8_4_ | (uint)!bVar17 * auVar135._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar157._12_4_ =
                 (float)((uint)bVar17 * auVar132._12_4_ | (uint)!bVar17 * auVar135._12_4_);
            bVar17 = (bool)((byte)(uVar106 >> 4) & 1);
            auVar157._16_4_ =
                 (float)((uint)bVar17 * auVar132._16_4_ | (uint)!bVar17 * auVar135._16_4_);
            bVar17 = (bool)((byte)(uVar106 >> 5) & 1);
            auVar157._20_4_ =
                 (float)((uint)bVar17 * auVar132._20_4_ | (uint)!bVar17 * auVar135._20_4_);
            bVar17 = (bool)((byte)(uVar106 >> 6) & 1);
            auVar157._24_4_ =
                 (float)((uint)bVar17 * auVar132._24_4_ | (uint)!bVar17 * auVar135._24_4_);
            bVar17 = SUB81(uVar106 >> 7,0);
            auVar157._28_4_ = (uint)bVar17 * auVar132._28_4_ | (uint)!bVar17 * auVar135._28_4_;
            auVar226._8_4_ = 0x80000000;
            auVar226._0_8_ = 0x8000000080000000;
            auVar226._12_4_ = 0x80000000;
            auVar226._16_4_ = 0x80000000;
            auVar226._20_4_ = 0x80000000;
            auVar226._24_4_ = 0x80000000;
            auVar226._28_4_ = 0x80000000;
            auVar141 = vxorps_avx512vl(auVar156,auVar226);
            auVar135 = auVar239._0_32_;
            auVar142 = vfmadd213ps_avx512vl(auVar154,auVar154,auVar135);
            auVar238 = vfmadd231ps_fma(auVar142,auVar155,auVar155);
            auVar142 = vrsqrt14ps_avx512vl(ZEXT1632(auVar238));
            auVar233._8_4_ = 0xbf000000;
            auVar233._0_8_ = 0xbf000000bf000000;
            auVar233._12_4_ = 0xbf000000;
            auVar233._16_4_ = 0xbf000000;
            auVar233._20_4_ = 0xbf000000;
            auVar233._24_4_ = 0xbf000000;
            auVar233._28_4_ = 0xbf000000;
            fVar205 = auVar142._0_4_;
            fVar174 = auVar142._4_4_;
            fVar211 = auVar142._8_4_;
            fVar212 = auVar142._12_4_;
            fVar195 = auVar142._16_4_;
            fVar204 = auVar142._20_4_;
            fVar116 = auVar142._24_4_;
            auVar67._4_4_ = fVar174 * fVar174 * fVar174 * auVar238._4_4_ * -0.5;
            auVar67._0_4_ = fVar205 * fVar205 * fVar205 * auVar238._0_4_ * -0.5;
            auVar67._8_4_ = fVar211 * fVar211 * fVar211 * auVar238._8_4_ * -0.5;
            auVar67._12_4_ = fVar212 * fVar212 * fVar212 * auVar238._12_4_ * -0.5;
            auVar67._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar67._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
            auVar67._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar67._28_4_ = auVar155._28_4_;
            auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar142 = vfmadd231ps_avx512vl(auVar67,auVar140,auVar142);
            auVar68._4_4_ = auVar155._4_4_ * auVar142._4_4_;
            auVar68._0_4_ = auVar155._0_4_ * auVar142._0_4_;
            auVar68._8_4_ = auVar155._8_4_ * auVar142._8_4_;
            auVar68._12_4_ = auVar155._12_4_ * auVar142._12_4_;
            auVar68._16_4_ = auVar155._16_4_ * auVar142._16_4_;
            auVar68._20_4_ = auVar155._20_4_ * auVar142._20_4_;
            auVar68._24_4_ = auVar155._24_4_ * auVar142._24_4_;
            auVar68._28_4_ = 0;
            auVar69._4_4_ = auVar142._4_4_ * -auVar154._4_4_;
            auVar69._0_4_ = auVar142._0_4_ * -auVar154._0_4_;
            auVar69._8_4_ = auVar142._8_4_ * -auVar154._8_4_;
            auVar69._12_4_ = auVar142._12_4_ * -auVar154._12_4_;
            auVar69._16_4_ = auVar142._16_4_ * -auVar154._16_4_;
            auVar69._20_4_ = auVar142._20_4_ * -auVar154._20_4_;
            auVar69._24_4_ = auVar142._24_4_ * -auVar154._24_4_;
            auVar69._28_4_ = auVar155._28_4_;
            auVar127 = vmulps_avx512vl(auVar142,auVar135);
            auVar142 = vfmadd213ps_avx512vl(auVar156,auVar156,auVar135);
            auVar142 = vfmadd231ps_avx512vl(auVar142,auVar157,auVar157);
            auVar131 = vrsqrt14ps_avx512vl(auVar142);
            auVar142 = vmulps_avx512vl(auVar142,auVar233);
            fVar205 = auVar131._0_4_;
            fVar174 = auVar131._4_4_;
            fVar211 = auVar131._8_4_;
            fVar212 = auVar131._12_4_;
            fVar195 = auVar131._16_4_;
            fVar204 = auVar131._20_4_;
            fVar116 = auVar131._24_4_;
            auVar70._4_4_ = fVar174 * fVar174 * fVar174 * auVar142._4_4_;
            auVar70._0_4_ = fVar205 * fVar205 * fVar205 * auVar142._0_4_;
            auVar70._8_4_ = fVar211 * fVar211 * fVar211 * auVar142._8_4_;
            auVar70._12_4_ = fVar212 * fVar212 * fVar212 * auVar142._12_4_;
            auVar70._16_4_ = fVar195 * fVar195 * fVar195 * auVar142._16_4_;
            auVar70._20_4_ = fVar204 * fVar204 * fVar204 * auVar142._20_4_;
            auVar70._24_4_ = fVar116 * fVar116 * fVar116 * auVar142._24_4_;
            auVar70._28_4_ = auVar142._28_4_;
            auVar142 = vfmadd231ps_avx512vl(auVar70,auVar140,auVar131);
            auVar71._4_4_ = auVar157._4_4_ * auVar142._4_4_;
            auVar71._0_4_ = auVar157._0_4_ * auVar142._0_4_;
            auVar71._8_4_ = auVar157._8_4_ * auVar142._8_4_;
            auVar71._12_4_ = auVar157._12_4_ * auVar142._12_4_;
            auVar71._16_4_ = auVar157._16_4_ * auVar142._16_4_;
            auVar71._20_4_ = auVar157._20_4_ * auVar142._20_4_;
            auVar71._24_4_ = auVar157._24_4_ * auVar142._24_4_;
            auVar71._28_4_ = auVar131._28_4_;
            auVar72._4_4_ = auVar142._4_4_ * auVar141._4_4_;
            auVar72._0_4_ = auVar142._0_4_ * auVar141._0_4_;
            auVar72._8_4_ = auVar142._8_4_ * auVar141._8_4_;
            auVar72._12_4_ = auVar142._12_4_ * auVar141._12_4_;
            auVar72._16_4_ = auVar142._16_4_ * auVar141._16_4_;
            auVar72._20_4_ = auVar142._20_4_ * auVar141._20_4_;
            auVar72._24_4_ = auVar142._24_4_ * auVar141._24_4_;
            auVar72._28_4_ = auVar141._28_4_;
            auVar141 = vmulps_avx512vl(auVar142,auVar135);
            auVar238 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar120),auVar133);
            auVar142 = ZEXT1632(auVar120);
            auVar10 = vfmadd213ps_fma(auVar69,auVar142,auVar123);
            auVar140 = vfmadd213ps_avx512vl(auVar127,auVar142,auVar130);
            auVar131 = vfmadd213ps_avx512vl(auVar71,ZEXT1632(auVar119),auVar124);
            auVar36 = vfnmadd213ps_fma(auVar68,auVar142,auVar133);
            auVar139 = ZEXT1632(auVar119);
            auVar118 = vfmadd213ps_fma(auVar72,auVar139,auVar134);
            auVar121 = vfnmadd213ps_fma(auVar69,auVar142,auVar123);
            auVar11 = vfmadd213ps_fma(auVar141,auVar139,auVar129);
            auVar123 = ZEXT1632(auVar120);
            auVar225 = vfnmadd231ps_fma(auVar130,auVar123,auVar127);
            auVar221 = vfnmadd213ps_fma(auVar71,auVar139,auVar124);
            auVar224 = vfnmadd213ps_fma(auVar72,auVar139,auVar134);
            auVar122 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar119),auVar141);
            auVar129 = vsubps_avx512vl(auVar131,ZEXT1632(auVar36));
            auVar141 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar121));
            auVar142 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar225));
            auVar73._4_4_ = auVar141._4_4_ * auVar225._4_4_;
            auVar73._0_4_ = auVar141._0_4_ * auVar225._0_4_;
            auVar73._8_4_ = auVar141._8_4_ * auVar225._8_4_;
            auVar73._12_4_ = auVar141._12_4_ * auVar225._12_4_;
            auVar73._16_4_ = auVar141._16_4_ * 0.0;
            auVar73._20_4_ = auVar141._20_4_ * 0.0;
            auVar73._24_4_ = auVar141._24_4_ * 0.0;
            auVar73._28_4_ = auVar127._28_4_;
            auVar120 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar121),auVar142);
            auVar74._4_4_ = auVar142._4_4_ * auVar36._4_4_;
            auVar74._0_4_ = auVar142._0_4_ * auVar36._0_4_;
            auVar74._8_4_ = auVar142._8_4_ * auVar36._8_4_;
            auVar74._12_4_ = auVar142._12_4_ * auVar36._12_4_;
            auVar74._16_4_ = auVar142._16_4_ * 0.0;
            auVar74._20_4_ = auVar142._20_4_ * 0.0;
            auVar74._24_4_ = auVar142._24_4_ * 0.0;
            auVar74._28_4_ = auVar142._28_4_;
            auVar189 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar225),auVar129);
            auVar75._4_4_ = auVar121._4_4_ * auVar129._4_4_;
            auVar75._0_4_ = auVar121._0_4_ * auVar129._0_4_;
            auVar75._8_4_ = auVar121._8_4_ * auVar129._8_4_;
            auVar75._12_4_ = auVar121._12_4_ * auVar129._12_4_;
            auVar75._16_4_ = auVar129._16_4_ * 0.0;
            auVar75._20_4_ = auVar129._20_4_ * 0.0;
            auVar75._24_4_ = auVar129._24_4_ * 0.0;
            auVar75._28_4_ = auVar129._28_4_;
            auVar196 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar36),auVar141);
            auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar196),auVar135,ZEXT1632(auVar189));
            auVar141 = vfmadd231ps_avx512vl(auVar141,auVar135,ZEXT1632(auVar120));
            uVar106 = vcmpps_avx512vl(auVar141,auVar135,2);
            bVar115 = (byte)uVar106;
            fVar166 = (float)((uint)(bVar115 & 1) * auVar238._0_4_ |
                             (uint)!(bool)(bVar115 & 1) * auVar221._0_4_);
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            fVar168 = (float)((uint)bVar17 * auVar238._4_4_ | (uint)!bVar17 * auVar221._4_4_);
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            fVar171 = (float)((uint)bVar17 * auVar238._8_4_ | (uint)!bVar17 * auVar221._8_4_);
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            fVar172 = (float)((uint)bVar17 * auVar238._12_4_ | (uint)!bVar17 * auVar221._12_4_);
            auVar139 = ZEXT1632(CONCAT412(fVar172,CONCAT48(fVar171,CONCAT44(fVar168,fVar166))));
            fVar167 = (float)((uint)(bVar115 & 1) * auVar10._0_4_ |
                             (uint)!(bool)(bVar115 & 1) * auVar224._0_4_);
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            fVar170 = (float)((uint)bVar17 * auVar10._4_4_ | (uint)!bVar17 * auVar224._4_4_);
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            fVar169 = (float)((uint)bVar17 * auVar10._8_4_ | (uint)!bVar17 * auVar224._8_4_);
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            fVar173 = (float)((uint)bVar17 * auVar10._12_4_ | (uint)!bVar17 * auVar224._12_4_);
            auVar125 = ZEXT1632(CONCAT412(fVar173,CONCAT48(fVar169,CONCAT44(fVar170,fVar167))));
            auVar158._0_4_ =
                 (float)((uint)(bVar115 & 1) * auVar140._0_4_ |
                        (uint)!(bool)(bVar115 & 1) * auVar122._0_4_);
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar158._4_4_ = (float)((uint)bVar17 * auVar140._4_4_ | (uint)!bVar17 * auVar122._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar158._8_4_ = (float)((uint)bVar17 * auVar140._8_4_ | (uint)!bVar17 * auVar122._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar158._12_4_ =
                 (float)((uint)bVar17 * auVar140._12_4_ | (uint)!bVar17 * auVar122._12_4_);
            fVar205 = (float)((uint)((byte)(uVar106 >> 4) & 1) * auVar140._16_4_);
            auVar158._16_4_ = fVar205;
            fVar174 = (float)((uint)((byte)(uVar106 >> 5) & 1) * auVar140._20_4_);
            auVar158._20_4_ = fVar174;
            fVar211 = (float)((uint)((byte)(uVar106 >> 6) & 1) * auVar140._24_4_);
            auVar158._24_4_ = fVar211;
            iVar1 = (uint)(byte)(uVar106 >> 7) * auVar140._28_4_;
            auVar158._28_4_ = iVar1;
            auVar141 = vblendmps_avx512vl(ZEXT1632(auVar36),auVar131);
            auVar159._0_4_ =
                 (uint)(bVar115 & 1) * auVar141._0_4_ | (uint)!(bool)(bVar115 & 1) * auVar120._0_4_;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar159._4_4_ = (uint)bVar17 * auVar141._4_4_ | (uint)!bVar17 * auVar120._4_4_;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar159._8_4_ = (uint)bVar17 * auVar141._8_4_ | (uint)!bVar17 * auVar120._8_4_;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar159._12_4_ = (uint)bVar17 * auVar141._12_4_ | (uint)!bVar17 * auVar120._12_4_;
            auVar159._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * auVar141._16_4_;
            auVar159._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * auVar141._20_4_;
            auVar159._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * auVar141._24_4_;
            auVar159._28_4_ = (uint)(byte)(uVar106 >> 7) * auVar141._28_4_;
            auVar141 = vblendmps_avx512vl(ZEXT1632(auVar121),ZEXT1632(auVar118));
            auVar160._0_4_ =
                 (float)((uint)(bVar115 & 1) * auVar141._0_4_ |
                        (uint)!(bool)(bVar115 & 1) * auVar238._0_4_);
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar160._4_4_ = (float)((uint)bVar17 * auVar141._4_4_ | (uint)!bVar17 * auVar238._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar160._8_4_ = (float)((uint)bVar17 * auVar141._8_4_ | (uint)!bVar17 * auVar238._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar160._12_4_ =
                 (float)((uint)bVar17 * auVar141._12_4_ | (uint)!bVar17 * auVar238._12_4_);
            fVar212 = (float)((uint)((byte)(uVar106 >> 4) & 1) * auVar141._16_4_);
            auVar160._16_4_ = fVar212;
            fVar195 = (float)((uint)((byte)(uVar106 >> 5) & 1) * auVar141._20_4_);
            auVar160._20_4_ = fVar195;
            fVar204 = (float)((uint)((byte)(uVar106 >> 6) & 1) * auVar141._24_4_);
            auVar160._24_4_ = fVar204;
            auVar160._28_4_ = (uint)(byte)(uVar106 >> 7) * auVar141._28_4_;
            auVar141 = vblendmps_avx512vl(ZEXT1632(auVar225),ZEXT1632(auVar11));
            auVar161._0_4_ =
                 (float)((uint)(bVar115 & 1) * auVar141._0_4_ |
                        (uint)!(bool)(bVar115 & 1) * auVar10._0_4_);
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar161._4_4_ = (float)((uint)bVar17 * auVar141._4_4_ | (uint)!bVar17 * auVar10._4_4_);
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar161._8_4_ = (float)((uint)bVar17 * auVar141._8_4_ | (uint)!bVar17 * auVar10._8_4_);
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar161._12_4_ =
                 (float)((uint)bVar17 * auVar141._12_4_ | (uint)!bVar17 * auVar10._12_4_);
            fVar117 = (float)((uint)((byte)(uVar106 >> 4) & 1) * auVar141._16_4_);
            auVar161._16_4_ = fVar117;
            fVar194 = (float)((uint)((byte)(uVar106 >> 5) & 1) * auVar141._20_4_);
            auVar161._20_4_ = fVar194;
            fVar116 = (float)((uint)((byte)(uVar106 >> 6) & 1) * auVar141._24_4_);
            auVar161._24_4_ = fVar116;
            iVar2 = (uint)(byte)(uVar106 >> 7) * auVar141._28_4_;
            auVar161._28_4_ = iVar2;
            auVar162._0_4_ =
                 (uint)(bVar115 & 1) * (int)auVar36._0_4_ |
                 (uint)!(bool)(bVar115 & 1) * auVar131._0_4_;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar17 * (int)auVar36._4_4_ | (uint)!bVar17 * auVar131._4_4_;
            bVar17 = (bool)((byte)(uVar106 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar17 * (int)auVar36._8_4_ | (uint)!bVar17 * auVar131._8_4_;
            bVar17 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar17 * (int)auVar36._12_4_ | (uint)!bVar17 * auVar131._12_4_;
            auVar162._16_4_ = (uint)!(bool)((byte)(uVar106 >> 4) & 1) * auVar131._16_4_;
            auVar162._20_4_ = (uint)!(bool)((byte)(uVar106 >> 5) & 1) * auVar131._20_4_;
            auVar162._24_4_ = (uint)!(bool)((byte)(uVar106 >> 6) & 1) * auVar131._24_4_;
            auVar162._28_4_ = (uint)!SUB81(uVar106 >> 7,0) * auVar131._28_4_;
            bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar106 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar106 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar106 >> 3) & 1);
            auVar131 = vsubps_avx512vl(auVar162,auVar139);
            auVar142 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar121._12_4_ |
                                                     (uint)!bVar21 * auVar118._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar121._8_4_ |
                                                              (uint)!bVar19 * auVar118._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar121._4_4_ |
                                                                       (uint)!bVar17 *
                                                                       auVar118._4_4_,
                                                                       (uint)(bVar115 & 1) *
                                                                       (int)auVar121._0_4_ |
                                                                       (uint)!(bool)(bVar115 & 1) *
                                                                       auVar118._0_4_)))),auVar125);
            auVar140 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar225._12_4_ |
                                                     (uint)!bVar22 * auVar11._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar225._8_4_ |
                                                              (uint)!bVar20 * auVar11._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar225._4_4_ |
                                                                       (uint)!bVar18 * auVar11._4_4_
                                                                       ,(uint)(bVar115 & 1) *
                                                                        (int)auVar225._0_4_ |
                                                                        (uint)!(bool)(bVar115 & 1) *
                                                                        auVar11._0_4_)))),auVar158);
            auVar127 = vsubps_avx(auVar139,auVar159);
            auVar129 = vsubps_avx(auVar125,auVar160);
            auVar130 = vsubps_avx(auVar158,auVar161);
            auVar76._4_4_ = auVar140._4_4_ * fVar168;
            auVar76._0_4_ = auVar140._0_4_ * fVar166;
            auVar76._8_4_ = auVar140._8_4_ * fVar171;
            auVar76._12_4_ = auVar140._12_4_ * fVar172;
            auVar76._16_4_ = auVar140._16_4_ * 0.0;
            auVar76._20_4_ = auVar140._20_4_ * 0.0;
            auVar76._24_4_ = auVar140._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar120 = vfmsub231ps_fma(auVar76,auVar158,auVar131);
            auVar202._0_4_ = fVar167 * auVar131._0_4_;
            auVar202._4_4_ = fVar170 * auVar131._4_4_;
            auVar202._8_4_ = fVar169 * auVar131._8_4_;
            auVar202._12_4_ = fVar173 * auVar131._12_4_;
            auVar202._16_4_ = auVar131._16_4_ * 0.0;
            auVar202._20_4_ = auVar131._20_4_ * 0.0;
            auVar202._24_4_ = auVar131._24_4_ * 0.0;
            auVar202._28_4_ = 0;
            auVar238 = vfmsub231ps_fma(auVar202,auVar139,auVar142);
            auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar238),auVar135,ZEXT1632(auVar120));
            auVar209._0_4_ = auVar142._0_4_ * auVar158._0_4_;
            auVar209._4_4_ = auVar142._4_4_ * auVar158._4_4_;
            auVar209._8_4_ = auVar142._8_4_ * auVar158._8_4_;
            auVar209._12_4_ = auVar142._12_4_ * auVar158._12_4_;
            auVar209._16_4_ = auVar142._16_4_ * fVar205;
            auVar209._20_4_ = auVar142._20_4_ * fVar174;
            auVar209._24_4_ = auVar142._24_4_ * fVar211;
            auVar209._28_4_ = 0;
            auVar120 = vfmsub231ps_fma(auVar209,auVar125,auVar140);
            auVar132 = vfmadd231ps_avx512vl(auVar141,auVar135,ZEXT1632(auVar120));
            auVar141 = vmulps_avx512vl(auVar130,auVar159);
            auVar141 = vfmsub231ps_avx512vl(auVar141,auVar127,auVar161);
            auVar77._4_4_ = auVar129._4_4_ * auVar161._4_4_;
            auVar77._0_4_ = auVar129._0_4_ * auVar161._0_4_;
            auVar77._8_4_ = auVar129._8_4_ * auVar161._8_4_;
            auVar77._12_4_ = auVar129._12_4_ * auVar161._12_4_;
            auVar77._16_4_ = auVar129._16_4_ * fVar117;
            auVar77._20_4_ = auVar129._20_4_ * fVar194;
            auVar77._24_4_ = auVar129._24_4_ * fVar116;
            auVar77._28_4_ = iVar2;
            auVar120 = vfmsub231ps_fma(auVar77,auVar160,auVar130);
            auVar210._0_4_ = auVar160._0_4_ * auVar127._0_4_;
            auVar210._4_4_ = auVar160._4_4_ * auVar127._4_4_;
            auVar210._8_4_ = auVar160._8_4_ * auVar127._8_4_;
            auVar210._12_4_ = auVar160._12_4_ * auVar127._12_4_;
            auVar210._16_4_ = fVar212 * auVar127._16_4_;
            auVar210._20_4_ = fVar195 * auVar127._20_4_;
            auVar210._24_4_ = fVar204 * auVar127._24_4_;
            auVar210._28_4_ = 0;
            auVar238 = vfmsub231ps_fma(auVar210,auVar129,auVar159);
            auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar238),auVar135,auVar141);
            auVar133 = vfmadd231ps_avx512vl(auVar141,auVar135,ZEXT1632(auVar120));
            auVar141 = vmaxps_avx(auVar132,auVar133);
            uVar188 = vcmpps_avx512vl(auVar141,auVar135,2);
            local_670 = local_670 & (byte)uVar188;
            auVar237 = ZEXT3264(auVar219);
            if (local_670 == 0) {
LAB_01e001d6:
              local_670 = 0;
            }
            else {
              auVar78._4_4_ = auVar130._4_4_ * auVar142._4_4_;
              auVar78._0_4_ = auVar130._0_4_ * auVar142._0_4_;
              auVar78._8_4_ = auVar130._8_4_ * auVar142._8_4_;
              auVar78._12_4_ = auVar130._12_4_ * auVar142._12_4_;
              auVar78._16_4_ = auVar130._16_4_ * auVar142._16_4_;
              auVar78._20_4_ = auVar130._20_4_ * auVar142._20_4_;
              auVar78._24_4_ = auVar130._24_4_ * auVar142._24_4_;
              auVar78._28_4_ = auVar141._28_4_;
              auVar10 = vfmsub231ps_fma(auVar78,auVar129,auVar140);
              auVar79._4_4_ = auVar140._4_4_ * auVar127._4_4_;
              auVar79._0_4_ = auVar140._0_4_ * auVar127._0_4_;
              auVar79._8_4_ = auVar140._8_4_ * auVar127._8_4_;
              auVar79._12_4_ = auVar140._12_4_ * auVar127._12_4_;
              auVar79._16_4_ = auVar140._16_4_ * auVar127._16_4_;
              auVar79._20_4_ = auVar140._20_4_ * auVar127._20_4_;
              auVar79._24_4_ = auVar140._24_4_ * auVar127._24_4_;
              auVar79._28_4_ = auVar140._28_4_;
              auVar238 = vfmsub231ps_fma(auVar79,auVar131,auVar130);
              auVar80._4_4_ = auVar129._4_4_ * auVar131._4_4_;
              auVar80._0_4_ = auVar129._0_4_ * auVar131._0_4_;
              auVar80._8_4_ = auVar129._8_4_ * auVar131._8_4_;
              auVar80._12_4_ = auVar129._12_4_ * auVar131._12_4_;
              auVar80._16_4_ = auVar129._16_4_ * auVar131._16_4_;
              auVar80._20_4_ = auVar129._20_4_ * auVar131._20_4_;
              auVar80._24_4_ = auVar129._24_4_ * auVar131._24_4_;
              auVar80._28_4_ = auVar129._28_4_;
              auVar118 = vfmsub231ps_fma(auVar80,auVar127,auVar142);
              auVar120 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar238),ZEXT1632(auVar118));
              auVar141 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar10),auVar135);
              auVar142 = vrcp14ps_avx512vl(auVar141);
              auVar42._8_4_ = 0x3f800000;
              auVar42._0_8_ = &DAT_3f8000003f800000;
              auVar42._12_4_ = 0x3f800000;
              auVar42._16_4_ = 0x3f800000;
              auVar42._20_4_ = 0x3f800000;
              auVar42._24_4_ = 0x3f800000;
              auVar42._28_4_ = 0x3f800000;
              auVar140 = vfnmadd213ps_avx512vl(auVar142,auVar141,auVar42);
              auVar120 = vfmadd132ps_fma(auVar140,auVar142,auVar142);
              auVar81._4_4_ = auVar118._4_4_ * auVar158._4_4_;
              auVar81._0_4_ = auVar118._0_4_ * auVar158._0_4_;
              auVar81._8_4_ = auVar118._8_4_ * auVar158._8_4_;
              auVar81._12_4_ = auVar118._12_4_ * auVar158._12_4_;
              auVar81._16_4_ = fVar205 * 0.0;
              auVar81._20_4_ = fVar174 * 0.0;
              auVar81._24_4_ = fVar211 * 0.0;
              auVar81._28_4_ = iVar1;
              auVar238 = vfmadd231ps_fma(auVar81,auVar125,ZEXT1632(auVar238));
              auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),auVar139,ZEXT1632(auVar10));
              fVar205 = auVar120._0_4_;
              fVar174 = auVar120._4_4_;
              fVar211 = auVar120._8_4_;
              fVar212 = auVar120._12_4_;
              auVar142 = ZEXT1632(CONCAT412(auVar238._12_4_ * fVar212,
                                            CONCAT48(auVar238._8_4_ * fVar211,
                                                     CONCAT44(auVar238._4_4_ * fVar174,
                                                              auVar238._0_4_ * fVar205))));
              auVar103._4_4_ = uStack_75c;
              auVar103._0_4_ = local_760;
              auVar103._8_4_ = uStack_758;
              auVar103._12_4_ = uStack_754;
              auVar103._16_4_ = uStack_750;
              auVar103._20_4_ = uStack_74c;
              auVar103._24_4_ = uStack_748;
              auVar103._28_4_ = uStack_744;
              uVar188 = vcmpps_avx512vl(auVar142,auVar103,0xd);
              uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar43._4_4_ = uVar175;
              auVar43._0_4_ = uVar175;
              auVar43._8_4_ = uVar175;
              auVar43._12_4_ = uVar175;
              auVar43._16_4_ = uVar175;
              auVar43._20_4_ = uVar175;
              auVar43._24_4_ = uVar175;
              auVar43._28_4_ = uVar175;
              uVar33 = vcmpps_avx512vl(auVar142,auVar43,2);
              local_670 = (byte)uVar188 & (byte)uVar33 & local_670;
              if (local_670 == 0) goto LAB_01e001d6;
              uVar188 = vcmpps_avx512vl(auVar141,auVar135,4);
              if ((local_670 & (byte)uVar188) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar188;
                fVar195 = auVar132._0_4_ * fVar205;
                fVar204 = auVar132._4_4_ * fVar174;
                auVar82._4_4_ = fVar204;
                auVar82._0_4_ = fVar195;
                fVar116 = auVar132._8_4_ * fVar211;
                auVar82._8_4_ = fVar116;
                fVar117 = auVar132._12_4_ * fVar212;
                auVar82._12_4_ = fVar117;
                fVar194 = auVar132._16_4_ * 0.0;
                auVar82._16_4_ = fVar194;
                fVar166 = auVar132._20_4_ * 0.0;
                auVar82._20_4_ = fVar166;
                fVar167 = auVar132._24_4_ * 0.0;
                auVar82._24_4_ = fVar167;
                auVar82._28_4_ = auVar132._28_4_;
                fVar205 = auVar133._0_4_ * fVar205;
                fVar174 = auVar133._4_4_ * fVar174;
                auVar83._4_4_ = fVar174;
                auVar83._0_4_ = fVar205;
                fVar211 = auVar133._8_4_ * fVar211;
                auVar83._8_4_ = fVar211;
                fVar212 = auVar133._12_4_ * fVar212;
                auVar83._12_4_ = fVar212;
                fVar168 = auVar133._16_4_ * 0.0;
                auVar83._16_4_ = fVar168;
                fVar170 = auVar133._20_4_ * 0.0;
                auVar83._20_4_ = fVar170;
                fVar171 = auVar133._24_4_ * 0.0;
                auVar83._24_4_ = fVar171;
                auVar83._28_4_ = auVar133._28_4_;
                auVar218._8_4_ = 0x3f800000;
                auVar218._0_8_ = &DAT_3f8000003f800000;
                auVar218._12_4_ = 0x3f800000;
                auVar218._16_4_ = 0x3f800000;
                auVar218._20_4_ = 0x3f800000;
                auVar218._24_4_ = 0x3f800000;
                auVar218._28_4_ = 0x3f800000;
                auVar141 = vsubps_avx512vl(auVar218,auVar82);
                bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar106 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar106 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar106 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar106 >> 6) & 1);
                bVar23 = SUB81(uVar106 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar23 * auVar132._28_4_ |
                                              (uint)!bVar23 * auVar141._28_4_,
                                              CONCAT424((uint)bVar22 * (int)fVar167 |
                                                        (uint)!bVar22 * auVar141._24_4_,
                                                        CONCAT420((uint)bVar21 * (int)fVar166 |
                                                                  (uint)!bVar21 * auVar141._20_4_,
                                                                  CONCAT416((uint)bVar20 *
                                                                            (int)fVar194 |
                                                                            (uint)!bVar20 *
                                                                            auVar141._16_4_,
                                                                            CONCAT412((uint)bVar19 *
                                                                                      (int)fVar117 |
                                                                                      (uint)!bVar19
                                                                                      * auVar141.
                                                  _12_4_,CONCAT48((uint)bVar18 * (int)fVar116 |
                                                                  (uint)!bVar18 * auVar141._8_4_,
                                                                  CONCAT44((uint)bVar17 *
                                                                           (int)fVar204 |
                                                                           (uint)!bVar17 *
                                                                           auVar141._4_4_,
                                                                           (uint)(bVar115 & 1) *
                                                                           (int)fVar195 |
                                                                           (uint)!(bool)(bVar115 & 1
                                                                                        ) *
                                                                           auVar141._0_4_))))))));
                auVar141 = vsubps_avx(auVar218,auVar83);
                bVar17 = (bool)((byte)(uVar106 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar106 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar106 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar106 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar106 >> 6) & 1);
                bVar23 = SUB81(uVar106 >> 7,0);
                local_5c0._4_4_ = (uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar141._4_4_;
                local_5c0._0_4_ =
                     (uint)(bVar115 & 1) * (int)fVar205 |
                     (uint)!(bool)(bVar115 & 1) * auVar141._0_4_;
                local_5c0._8_4_ = (uint)bVar18 * (int)fVar211 | (uint)!bVar18 * auVar141._8_4_;
                local_5c0._12_4_ = (uint)bVar19 * (int)fVar212 | (uint)!bVar19 * auVar141._12_4_;
                local_5c0._16_4_ = (uint)bVar20 * (int)fVar168 | (uint)!bVar20 * auVar141._16_4_;
                local_5c0._20_4_ = (uint)bVar21 * (int)fVar170 | (uint)!bVar21 * auVar141._20_4_;
                local_5c0._24_4_ = (uint)bVar22 * (int)fVar171 | (uint)!bVar22 * auVar141._24_4_;
                local_5c0._28_4_ = (uint)bVar23 * auVar133._28_4_ | (uint)!bVar23 * auVar141._28_4_;
                in_ZMM21 = ZEXT3264(auVar142);
              }
            }
            auVar234 = ZEXT3264(local_8c0);
            if (local_670 != 0) {
              auVar141 = vsubps_avx(ZEXT1632(auVar119),auVar123);
              local_840 = in_ZMM20._0_32_;
              auVar141 = vfmadd213ps_avx512vl(auVar141,local_840,auVar123);
              auVar182._0_4_ = auVar141._0_4_ + auVar141._0_4_;
              auVar182._4_4_ = auVar141._4_4_ + auVar141._4_4_;
              auVar182._8_4_ = auVar141._8_4_ + auVar141._8_4_;
              auVar182._12_4_ = auVar141._12_4_ + auVar141._12_4_;
              auVar182._16_4_ = auVar141._16_4_ + auVar141._16_4_;
              auVar182._20_4_ = auVar141._20_4_ + auVar141._20_4_;
              auVar182._24_4_ = auVar141._24_4_ + auVar141._24_4_;
              auVar182._28_4_ = auVar141._28_4_ + auVar141._28_4_;
              uVar175 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar44._4_4_ = uVar175;
              auVar44._0_4_ = uVar175;
              auVar44._8_4_ = uVar175;
              auVar44._12_4_ = uVar175;
              auVar44._16_4_ = uVar175;
              auVar44._20_4_ = uVar175;
              auVar44._24_4_ = uVar175;
              auVar44._28_4_ = uVar175;
              auVar141 = vmulps_avx512vl(auVar182,auVar44);
              local_860 = in_ZMM21._0_32_;
              uVar188 = vcmpps_avx512vl(local_860,auVar141,6);
              local_670 = local_670 & (byte)uVar188;
              uVar110 = (uint)local_670;
              if (local_670 != 0) {
                auVar183._8_4_ = 0xbf800000;
                auVar183._0_8_ = 0xbf800000bf800000;
                auVar183._12_4_ = 0xbf800000;
                auVar183._16_4_ = 0xbf800000;
                auVar183._20_4_ = 0xbf800000;
                auVar183._24_4_ = 0xbf800000;
                auVar183._28_4_ = 0xbf800000;
                auVar45._8_4_ = 0x40000000;
                auVar45._0_8_ = 0x4000000040000000;
                auVar45._12_4_ = 0x40000000;
                auVar45._16_4_ = 0x40000000;
                auVar45._20_4_ = 0x40000000;
                auVar45._24_4_ = 0x40000000;
                auVar45._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5c0,auVar183,auVar45);
                local_5c0 = local_700;
                auVar141 = local_5c0;
                local_6c0 = (undefined4)lVar114;
                local_680 = CONCAT44(fStack_8dc,local_8e0);
                uStack_678 = CONCAT44(fStack_8d4,fStack_8d8);
                pGVar111 = (context->scene->geometries).items[uVar112].ptr;
                local_5c0 = auVar141;
                if ((pGVar111->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar141 = vaddps_avx512vl(local_840,_DAT_02020f40);
                  auVar120 = vcvtsi2ss_avx512f(auVar235._0_16_,local_6c0);
                  fVar205 = auVar120._0_4_;
                  local_660[0] = (fVar205 + auVar141._0_4_) * local_740;
                  local_660[1] = (fVar205 + auVar141._4_4_) * (float)auStack_73c._0_4_;
                  local_660[2] = (fVar205 + auVar141._8_4_) * (float)auStack_73c._4_4_;
                  local_660[3] = (fVar205 + auVar141._12_4_) * fStack_734;
                  fStack_650 = (fVar205 + auVar141._16_4_) * fStack_730;
                  fStack_64c = (fVar205 + auVar141._20_4_) * fStack_72c;
                  fStack_648 = (fVar205 + auVar141._24_4_) * fStack_728;
                  fStack_644 = fVar205 + auVar141._28_4_;
                  local_5c0._0_8_ = local_700._0_8_;
                  local_5c0._8_8_ = local_700._8_8_;
                  local_5c0._16_8_ = local_700._16_8_;
                  local_5c0._24_8_ = local_700._24_8_;
                  local_640 = local_5c0._0_8_;
                  uStack_638 = local_5c0._8_8_;
                  uStack_630 = local_5c0._16_8_;
                  uStack_628 = local_5c0._24_8_;
                  local_620 = local_860;
                  auVar184._8_4_ = 0x7f800000;
                  auVar184._0_8_ = 0x7f8000007f800000;
                  auVar184._12_4_ = 0x7f800000;
                  auVar184._16_4_ = 0x7f800000;
                  auVar184._20_4_ = 0x7f800000;
                  auVar184._24_4_ = 0x7f800000;
                  auVar184._28_4_ = 0x7f800000;
                  auVar141 = vblendmps_avx512vl(auVar184,local_860);
                  auVar163._0_4_ =
                       (uint)(local_670 & 1) * auVar141._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 1 & 1);
                  auVar163._4_4_ = (uint)bVar17 * auVar141._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 2 & 1);
                  auVar163._8_4_ = (uint)bVar17 * auVar141._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 3 & 1);
                  auVar163._12_4_ = (uint)bVar17 * auVar141._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 4 & 1);
                  auVar163._16_4_ = (uint)bVar17 * auVar141._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 5 & 1);
                  auVar163._20_4_ = (uint)bVar17 * auVar141._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_670 >> 6 & 1);
                  auVar163._24_4_ = (uint)bVar17 * auVar141._24_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar163._28_4_ =
                       (uint)(local_670 >> 7) * auVar141._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar141 = vshufps_avx(auVar163,auVar163,0xb1);
                  auVar141 = vminps_avx(auVar163,auVar141);
                  auVar142 = vshufpd_avx(auVar141,auVar141,5);
                  auVar141 = vminps_avx(auVar141,auVar142);
                  auVar142 = vpermpd_avx2(auVar141,0x4e);
                  auVar141 = vminps_avx(auVar141,auVar142);
                  uVar188 = vcmpps_avx512vl(auVar163,auVar141,0);
                  bVar105 = (byte)uVar188 & local_670;
                  bVar115 = local_670;
                  if (bVar105 != 0) {
                    bVar115 = bVar105;
                  }
                  uVar108 = 0;
                  for (uVar107 = (uint)bVar115; (uVar107 & 1) == 0;
                      uVar107 = uVar107 >> 1 | 0x80000000) {
                    uVar108 = uVar108 + 1;
                  }
                  uVar106 = (ulong)uVar108;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar111->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar205 = local_660[uVar106];
                    uVar175 = *(undefined4 *)((long)&local_640 + uVar106 * 4);
                    fVar211 = 1.0 - fVar205;
                    fVar174 = fVar211 * fVar211 * -3.0;
                    auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),
                                               ZEXT416((uint)(fVar205 * fVar211)),
                                               ZEXT416(0xc0000000));
                    auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar211)),
                                               ZEXT416((uint)(fVar205 * fVar205)),
                                               ZEXT416(0x40000000));
                    fVar211 = auVar120._0_4_ * 3.0;
                    fVar212 = auVar119._0_4_ * 3.0;
                    fVar195 = fVar205 * fVar205 * 3.0;
                    auVar214._0_4_ = fVar195 * local_8e0;
                    auVar214._4_4_ = fVar195 * fStack_8dc;
                    auVar214._8_4_ = fVar195 * fStack_8d8;
                    auVar214._12_4_ = fVar195 * fStack_8d4;
                    auVar192._4_4_ = fVar212;
                    auVar192._0_4_ = fVar212;
                    auVar192._8_4_ = fVar212;
                    auVar192._12_4_ = fVar212;
                    auVar120 = vfmadd132ps_fma(auVar192,auVar214,auVar8);
                    auVar198._4_4_ = fVar211;
                    auVar198._0_4_ = fVar211;
                    auVar198._8_4_ = fVar211;
                    auVar198._12_4_ = fVar211;
                    auVar120 = vfmadd132ps_fma(auVar198,auVar120,auVar9);
                    auVar193._4_4_ = fVar174;
                    auVar193._0_4_ = fVar174;
                    auVar193._8_4_ = fVar174;
                    auVar193._12_4_ = fVar174;
                    auVar120 = vfmadd213ps_fma(auVar193,auVar31,auVar120);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar106 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar120._0_4_;
                    uVar15 = vextractps_avx(auVar120,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                    uVar15 = vextractps_avx(auVar120,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar205;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar175;
                    *(uint *)(ray + k * 4 + 0x440) = uVar13;
                    *(uint *)(ray + k * 4 + 0x480) = uVar112;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_820 = (float)uVar97;
                    fStack_81c = (float)((ulong)uVar97 >> 0x20);
                    fStack_818 = (float)uVar98;
                    fStack_814 = (float)((ulong)uVar98 >> 0x20);
                    local_570 = local_680;
                    uStack_568 = uStack_678;
                    local_8d0 = pGVar111;
                    local_810 = uVar32;
                    uStack_808 = uVar34;
                    local_720 = local_840;
                    local_6e0 = local_860;
                    local_6bc = iVar14;
                    local_6b0 = auVar31;
                    local_6a0 = uVar32;
                    uStack_698 = uVar34;
                    local_690 = uVar97;
                    uStack_688 = uVar98;
                    do {
                      auVar238 = auVar239._0_16_;
                      local_800 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar106]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar106 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_620 + uVar106 * 4);
                      local_910.context = context->user;
                      fVar212 = local_200._0_4_;
                      fVar174 = 1.0 - fVar212;
                      fVar205 = fVar174 * fVar174 * -3.0;
                      auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                                 ZEXT416((uint)(fVar212 * fVar174)),
                                                 ZEXT416(0xc0000000));
                      auVar119 = vfmsub132ss_fma(ZEXT416((uint)(fVar212 * fVar174)),
                                                 ZEXT416((uint)(fVar212 * fVar212)),
                                                 ZEXT416(0x40000000));
                      fVar174 = auVar120._0_4_ * 3.0;
                      fVar211 = auVar119._0_4_ * 3.0;
                      fVar212 = fVar212 * fVar212 * 3.0;
                      auVar215._0_4_ = fVar212 * (float)local_570;
                      auVar215._4_4_ = fVar212 * local_570._4_4_;
                      auVar215._8_4_ = fVar212 * (float)uStack_568;
                      auVar215._12_4_ = fVar212 * uStack_568._4_4_;
                      auVar176._4_4_ = fVar211;
                      auVar176._0_4_ = fVar211;
                      auVar176._8_4_ = fVar211;
                      auVar176._12_4_ = fVar211;
                      auVar99._4_4_ = fStack_81c;
                      auVar99._0_4_ = local_820;
                      auVar99._8_4_ = fStack_818;
                      auVar99._12_4_ = fStack_814;
                      auVar120 = vfmadd132ps_fma(auVar176,auVar215,auVar99);
                      auVar199._4_4_ = fVar174;
                      auVar199._0_4_ = fVar174;
                      auVar199._8_4_ = fVar174;
                      auVar199._12_4_ = fVar174;
                      auVar100._8_8_ = uStack_808;
                      auVar100._0_8_ = local_810;
                      auVar120 = vfmadd132ps_fma(auVar199,auVar120,auVar100);
                      auVar177._4_4_ = fVar205;
                      auVar177._0_4_ = fVar205;
                      auVar177._8_4_ = fVar205;
                      auVar177._12_4_ = fVar205;
                      auVar120 = vfmadd213ps_fma(auVar177,auVar31,auVar120);
                      auVar203 = vbroadcastss_avx512f(auVar120);
                      auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar220,ZEXT1664(auVar120));
                      auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar120));
                      local_2c0[0] = (RTCHitN)auVar203[0];
                      local_2c0[1] = (RTCHitN)auVar203[1];
                      local_2c0[2] = (RTCHitN)auVar203[2];
                      local_2c0[3] = (RTCHitN)auVar203[3];
                      local_2c0[4] = (RTCHitN)auVar203[4];
                      local_2c0[5] = (RTCHitN)auVar203[5];
                      local_2c0[6] = (RTCHitN)auVar203[6];
                      local_2c0[7] = (RTCHitN)auVar203[7];
                      local_2c0[8] = (RTCHitN)auVar203[8];
                      local_2c0[9] = (RTCHitN)auVar203[9];
                      local_2c0[10] = (RTCHitN)auVar203[10];
                      local_2c0[0xb] = (RTCHitN)auVar203[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar203[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar203[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar203[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar203[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar203[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar203[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar203[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar203[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar203[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar203[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar203[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar203[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar203[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar203[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar203[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar203[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar203[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar203[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar203[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar203[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar203[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar203[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar203[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar203[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar203[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar203[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar203[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar203[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar203[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar203[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar203[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar203[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar203[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar203[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar203[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar203[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar203[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar203[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar203[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar203[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar203[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar203[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar203[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar203[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar203[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar203[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar203[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar203[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar203[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar203[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar203[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar203[0x3f];
                      local_180 = local_500._0_8_;
                      uStack_178 = local_500._8_8_;
                      uStack_170 = local_500._16_8_;
                      uStack_168 = local_500._24_8_;
                      uStack_160 = local_500._32_8_;
                      uStack_158 = local_500._40_8_;
                      uStack_150 = local_500._48_8_;
                      uStack_148 = local_500._56_8_;
                      auVar203 = vmovdqa64_avx512f(local_4c0);
                      local_140 = vmovdqa64_avx512f(auVar203);
                      auVar141 = vpcmpeqd_avx2(auVar203._0_32_,auVar203._0_32_);
                      local_8c8[3] = auVar141;
                      local_8c8[2] = auVar141;
                      local_8c8[1] = auVar141;
                      *local_8c8 = auVar141;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_910.valid = (int *)local_600;
                      local_910.geometryUserPtr = pGVar111->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_540._0_4_ = uVar110;
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar111->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar111->intersectionFilterN)(&local_910);
                        auVar240 = ZEXT3264(local_8a0);
                        auVar187 = ZEXT3264(local_880);
                        auVar234 = ZEXT3264(local_8c0);
                        auVar237 = ZEXT3264(local_7c0);
                        auVar236 = ZEXT3264(local_7a0);
                        in_ZMM21 = ZEXT3264(local_860);
                        in_ZMM20 = ZEXT3264(local_840);
                        auVar120 = vxorps_avx512vl(auVar238,auVar238);
                        auVar239 = ZEXT1664(auVar120);
                        pGVar111 = local_8d0;
                        uVar110 = local_540._0_4_;
                      }
                      bVar115 = (byte)uVar110;
                      auVar120 = auVar239._0_16_;
                      auVar203 = vmovdqa64_avx512f(local_600);
                      uVar188 = vptestmd_avx512f(auVar203,auVar203);
                      if ((short)uVar188 == 0) {
LAB_01e00640:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_800;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar111->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var16)(&local_910);
                          bVar115 = local_540[0];
                          auVar240 = ZEXT3264(local_8a0);
                          auVar187 = ZEXT3264(local_880);
                          auVar234 = ZEXT3264(local_8c0);
                          auVar237 = ZEXT3264(local_7c0);
                          auVar236 = ZEXT3264(local_7a0);
                          in_ZMM21 = ZEXT3264(local_860);
                          in_ZMM20 = ZEXT3264(local_840);
                          auVar120 = vxorps_avx512vl(auVar120,auVar120);
                          auVar239 = ZEXT1664(auVar120);
                          pGVar111 = local_8d0;
                        }
                        auVar203 = vmovdqa64_avx512f(local_600);
                        uVar109 = vptestmd_avx512f(auVar203,auVar203);
                        if ((short)uVar109 == 0) goto LAB_01e00640;
                        iVar1 = *(int *)(local_910.hit + 4);
                        iVar2 = *(int *)(local_910.hit + 8);
                        iVar84 = *(int *)(local_910.hit + 0xc);
                        iVar85 = *(int *)(local_910.hit + 0x10);
                        iVar86 = *(int *)(local_910.hit + 0x14);
                        iVar87 = *(int *)(local_910.hit + 0x18);
                        iVar88 = *(int *)(local_910.hit + 0x1c);
                        iVar89 = *(int *)(local_910.hit + 0x20);
                        iVar90 = *(int *)(local_910.hit + 0x24);
                        iVar91 = *(int *)(local_910.hit + 0x28);
                        iVar92 = *(int *)(local_910.hit + 0x2c);
                        iVar93 = *(int *)(local_910.hit + 0x30);
                        iVar94 = *(int *)(local_910.hit + 0x34);
                        iVar95 = *(int *)(local_910.hit + 0x38);
                        iVar96 = *(int *)(local_910.hit + 0x3c);
                        bVar105 = (byte)uVar109;
                        bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                        bVar104 = (byte)(uVar109 >> 8);
                        bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                        bVar30 = SUB81(uVar109 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x300) =
                             (uint)(bVar105 & 1) * *(int *)local_910.hit |
                             (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x300);
                        *(uint *)(local_910.ray + 0x304) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x304);
                        *(uint *)(local_910.ray + 0x308) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x308);
                        *(uint *)(local_910.ray + 0x30c) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x30c)
                        ;
                        *(uint *)(local_910.ray + 0x310) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x310)
                        ;
                        *(uint *)(local_910.ray + 0x314) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x314)
                        ;
                        *(uint *)(local_910.ray + 0x318) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x318)
                        ;
                        *(uint *)(local_910.ray + 0x31c) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x31c)
                        ;
                        *(uint *)(local_910.ray + 800) =
                             (uint)(bVar104 & 1) * iVar89 |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 800);
                        *(uint *)(local_910.ray + 0x324) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x324)
                        ;
                        *(uint *)(local_910.ray + 0x328) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x328)
                        ;
                        *(uint *)(local_910.ray + 0x32c) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x32c)
                        ;
                        *(uint *)(local_910.ray + 0x330) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x330)
                        ;
                        *(uint *)(local_910.ray + 0x334) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x334)
                        ;
                        *(uint *)(local_910.ray + 0x338) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x338)
                        ;
                        *(uint *)(local_910.ray + 0x33c) =
                             (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x44);
                        iVar2 = *(int *)(local_910.hit + 0x48);
                        iVar84 = *(int *)(local_910.hit + 0x4c);
                        iVar85 = *(int *)(local_910.hit + 0x50);
                        iVar86 = *(int *)(local_910.hit + 0x54);
                        iVar87 = *(int *)(local_910.hit + 0x58);
                        iVar88 = *(int *)(local_910.hit + 0x5c);
                        iVar89 = *(int *)(local_910.hit + 0x60);
                        iVar90 = *(int *)(local_910.hit + 100);
                        iVar91 = *(int *)(local_910.hit + 0x68);
                        iVar92 = *(int *)(local_910.hit + 0x6c);
                        iVar93 = *(int *)(local_910.hit + 0x70);
                        iVar94 = *(int *)(local_910.hit + 0x74);
                        iVar95 = *(int *)(local_910.hit + 0x78);
                        iVar96 = *(int *)(local_910.hit + 0x7c);
                        bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                        bVar30 = SUB81(uVar109 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x340) =
                             (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x40) |
                             (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x340);
                        *(uint *)(local_910.ray + 0x344) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x344);
                        *(uint *)(local_910.ray + 0x348) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x348);
                        *(uint *)(local_910.ray + 0x34c) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x34c)
                        ;
                        *(uint *)(local_910.ray + 0x350) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x350)
                        ;
                        *(uint *)(local_910.ray + 0x354) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x354)
                        ;
                        *(uint *)(local_910.ray + 0x358) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x358)
                        ;
                        *(uint *)(local_910.ray + 0x35c) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x35c)
                        ;
                        *(uint *)(local_910.ray + 0x360) =
                             (uint)(bVar104 & 1) * iVar89 |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x360);
                        *(uint *)(local_910.ray + 0x364) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x364)
                        ;
                        *(uint *)(local_910.ray + 0x368) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x368)
                        ;
                        *(uint *)(local_910.ray + 0x36c) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x36c)
                        ;
                        *(uint *)(local_910.ray + 0x370) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x370)
                        ;
                        *(uint *)(local_910.ray + 0x374) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x374)
                        ;
                        *(uint *)(local_910.ray + 0x378) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x378)
                        ;
                        *(uint *)(local_910.ray + 0x37c) =
                             (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x84);
                        iVar2 = *(int *)(local_910.hit + 0x88);
                        iVar84 = *(int *)(local_910.hit + 0x8c);
                        iVar85 = *(int *)(local_910.hit + 0x90);
                        iVar86 = *(int *)(local_910.hit + 0x94);
                        iVar87 = *(int *)(local_910.hit + 0x98);
                        iVar88 = *(int *)(local_910.hit + 0x9c);
                        iVar89 = *(int *)(local_910.hit + 0xa0);
                        iVar90 = *(int *)(local_910.hit + 0xa4);
                        iVar91 = *(int *)(local_910.hit + 0xa8);
                        iVar92 = *(int *)(local_910.hit + 0xac);
                        iVar93 = *(int *)(local_910.hit + 0xb0);
                        iVar94 = *(int *)(local_910.hit + 0xb4);
                        iVar95 = *(int *)(local_910.hit + 0xb8);
                        iVar96 = *(int *)(local_910.hit + 0xbc);
                        bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                        bVar30 = SUB81(uVar109 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x380) =
                             (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x80) |
                             (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x380);
                        *(uint *)(local_910.ray + 900) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 900);
                        *(uint *)(local_910.ray + 0x388) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x388);
                        *(uint *)(local_910.ray + 0x38c) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x38c)
                        ;
                        *(uint *)(local_910.ray + 0x390) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x390)
                        ;
                        *(uint *)(local_910.ray + 0x394) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x394)
                        ;
                        *(uint *)(local_910.ray + 0x398) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x398)
                        ;
                        *(uint *)(local_910.ray + 0x39c) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x39c)
                        ;
                        *(uint *)(local_910.ray + 0x3a0) =
                             (uint)(bVar104 & 1) * iVar89 |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3a0);
                        *(uint *)(local_910.ray + 0x3a4) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3a4)
                        ;
                        *(uint *)(local_910.ray + 0x3a8) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3a8)
                        ;
                        *(uint *)(local_910.ray + 0x3ac) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3ac)
                        ;
                        *(uint *)(local_910.ray + 0x3b0) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3b0)
                        ;
                        *(uint *)(local_910.ray + 0x3b4) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3b4)
                        ;
                        *(uint *)(local_910.ray + 0x3b8) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3b8)
                        ;
                        *(uint *)(local_910.ray + 0x3bc) =
                             (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0xc4);
                        iVar2 = *(int *)(local_910.hit + 200);
                        iVar84 = *(int *)(local_910.hit + 0xcc);
                        iVar85 = *(int *)(local_910.hit + 0xd0);
                        iVar86 = *(int *)(local_910.hit + 0xd4);
                        iVar87 = *(int *)(local_910.hit + 0xd8);
                        iVar88 = *(int *)(local_910.hit + 0xdc);
                        iVar89 = *(int *)(local_910.hit + 0xe0);
                        iVar90 = *(int *)(local_910.hit + 0xe4);
                        iVar91 = *(int *)(local_910.hit + 0xe8);
                        iVar92 = *(int *)(local_910.hit + 0xec);
                        iVar93 = *(int *)(local_910.hit + 0xf0);
                        iVar94 = *(int *)(local_910.hit + 0xf4);
                        iVar95 = *(int *)(local_910.hit + 0xf8);
                        iVar96 = *(int *)(local_910.hit + 0xfc);
                        bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                        bVar30 = SUB81(uVar109 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x3c0) =
                             (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0xc0) |
                             (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x3c0);
                        *(uint *)(local_910.ray + 0x3c4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x3c4);
                        *(uint *)(local_910.ray + 0x3c8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x3c8);
                        *(uint *)(local_910.ray + 0x3cc) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x3cc)
                        ;
                        *(uint *)(local_910.ray + 0x3d0) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x3d0)
                        ;
                        *(uint *)(local_910.ray + 0x3d4) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x3d4)
                        ;
                        *(uint *)(local_910.ray + 0x3d8) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x3d8)
                        ;
                        *(uint *)(local_910.ray + 0x3dc) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3dc)
                        ;
                        *(uint *)(local_910.ray + 0x3e0) =
                             (uint)(bVar104 & 1) * iVar89 |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3e0);
                        *(uint *)(local_910.ray + 0x3e4) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3e4)
                        ;
                        *(uint *)(local_910.ray + 1000) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 1000);
                        *(uint *)(local_910.ray + 0x3ec) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3ec)
                        ;
                        *(uint *)(local_910.ray + 0x3f0) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3f0)
                        ;
                        *(uint *)(local_910.ray + 0x3f4) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3f4)
                        ;
                        *(uint *)(local_910.ray + 0x3f8) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3f8)
                        ;
                        *(uint *)(local_910.ray + 0x3fc) =
                             (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x104);
                        iVar2 = *(int *)(local_910.hit + 0x108);
                        iVar84 = *(int *)(local_910.hit + 0x10c);
                        iVar85 = *(int *)(local_910.hit + 0x110);
                        iVar86 = *(int *)(local_910.hit + 0x114);
                        iVar87 = *(int *)(local_910.hit + 0x118);
                        iVar88 = *(int *)(local_910.hit + 0x11c);
                        iVar89 = *(int *)(local_910.hit + 0x120);
                        iVar90 = *(int *)(local_910.hit + 0x124);
                        iVar91 = *(int *)(local_910.hit + 0x128);
                        iVar92 = *(int *)(local_910.hit + 300);
                        iVar93 = *(int *)(local_910.hit + 0x130);
                        iVar94 = *(int *)(local_910.hit + 0x134);
                        iVar95 = *(int *)(local_910.hit + 0x138);
                        iVar96 = *(int *)(local_910.hit + 0x13c);
                        bVar17 = (bool)((byte)(uVar109 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar109 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar109 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar109 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar109 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar109 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar109 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar109 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar109 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar109 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar109 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar109 >> 0xe) & 1);
                        bVar30 = SUB81(uVar109 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x400) =
                             (uint)(bVar105 & 1) * *(int *)(local_910.hit + 0x100) |
                             (uint)!(bool)(bVar105 & 1) * *(int *)(local_910.ray + 0x400);
                        *(uint *)(local_910.ray + 0x404) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_910.ray + 0x404);
                        *(uint *)(local_910.ray + 0x408) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_910.ray + 0x408);
                        *(uint *)(local_910.ray + 0x40c) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x40c)
                        ;
                        *(uint *)(local_910.ray + 0x410) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x410)
                        ;
                        *(uint *)(local_910.ray + 0x414) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x414)
                        ;
                        *(uint *)(local_910.ray + 0x418) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x418)
                        ;
                        *(uint *)(local_910.ray + 0x41c) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_910.ray + 0x41c)
                        ;
                        *(uint *)(local_910.ray + 0x420) =
                             (uint)(bVar104 & 1) * iVar89 |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x420);
                        *(uint *)(local_910.ray + 0x424) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x424)
                        ;
                        *(uint *)(local_910.ray + 0x428) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x428)
                        ;
                        *(uint *)(local_910.ray + 0x42c) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x42c)
                        ;
                        *(uint *)(local_910.ray + 0x430) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x430)
                        ;
                        *(uint *)(local_910.ray + 0x434) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x434)
                        ;
                        *(uint *)(local_910.ray + 0x438) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x438)
                        ;
                        *(uint *)(local_910.ray + 0x43c) =
                             (uint)bVar30 * iVar96 | (uint)!bVar30 * *(int *)(local_910.ray + 0x43c)
                        ;
                        auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x140));
                        auVar203 = vmovdqu32_avx512f(auVar203);
                        *(undefined1 (*) [64])(local_910.ray + 0x440) = auVar203;
                        auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x180));
                        auVar203 = vmovdqu32_avx512f(auVar203);
                        *(undefined1 (*) [64])(local_910.ray + 0x480) = auVar203;
                        auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x1c0));
                        auVar203 = vmovdqa32_avx512f(auVar203);
                        *(undefined1 (*) [64])(local_910.ray + 0x4c0) = auVar203;
                        auVar203 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x200));
                        auVar203 = vmovdqa32_avx512f(auVar203);
                        *(undefined1 (*) [64])(local_910.ray + 0x500) = auVar203;
                      }
                      bVar115 = ~(byte)(1 << ((uint)uVar106 & 0x1f)) & bVar115;
                      uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar46._4_4_ = uVar175;
                      auVar46._0_4_ = uVar175;
                      auVar46._8_4_ = uVar175;
                      auVar46._12_4_ = uVar175;
                      auVar46._16_4_ = uVar175;
                      auVar46._20_4_ = uVar175;
                      auVar46._24_4_ = uVar175;
                      auVar46._28_4_ = uVar175;
                      uVar188 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar46,2);
                      bVar105 = bVar115 & (byte)uVar188;
                      uVar110 = (uint)bVar105;
                      if ((bVar115 & (byte)uVar188) != 0) {
                        auVar185._8_4_ = 0x7f800000;
                        auVar185._0_8_ = 0x7f8000007f800000;
                        auVar185._12_4_ = 0x7f800000;
                        auVar185._16_4_ = 0x7f800000;
                        auVar185._20_4_ = 0x7f800000;
                        auVar185._24_4_ = 0x7f800000;
                        auVar185._28_4_ = 0x7f800000;
                        auVar141 = vblendmps_avx512vl(auVar185,in_ZMM21._0_32_);
                        auVar164._0_4_ =
                             (uint)(bVar105 & 1) * auVar141._0_4_ |
                             (uint)!(bool)(bVar105 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 1 & 1);
                        auVar164._4_4_ = (uint)bVar17 * auVar141._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 2 & 1);
                        auVar164._8_4_ = (uint)bVar17 * auVar141._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 3 & 1);
                        auVar164._12_4_ =
                             (uint)bVar17 * auVar141._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 4 & 1);
                        auVar164._16_4_ =
                             (uint)bVar17 * auVar141._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 5 & 1);
                        auVar164._20_4_ =
                             (uint)bVar17 * auVar141._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar105 >> 6 & 1);
                        auVar164._24_4_ =
                             (uint)bVar17 * auVar141._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar164._28_4_ =
                             (uint)(bVar105 >> 7) * auVar141._28_4_ |
                             (uint)!(bool)(bVar105 >> 7) * 0x7f800000;
                        auVar141 = vshufps_avx(auVar164,auVar164,0xb1);
                        auVar141 = vminps_avx(auVar164,auVar141);
                        auVar142 = vshufpd_avx(auVar141,auVar141,5);
                        auVar141 = vminps_avx(auVar141,auVar142);
                        auVar142 = vpermpd_avx2(auVar141,0x4e);
                        auVar141 = vminps_avx(auVar141,auVar142);
                        uVar188 = vcmpps_avx512vl(auVar164,auVar141,0);
                        bVar115 = (byte)uVar188 & bVar105;
                        uVar108 = uVar110;
                        if (bVar115 != 0) {
                          uVar108 = (uint)bVar115;
                        }
                        uVar107 = 0;
                        for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
                          uVar107 = uVar107 + 1;
                        }
                        uVar106 = (ulong)uVar107;
                      }
                    } while (bVar105 != 0);
                  }
                }
              }
            }
          }
          auVar220 = ZEXT3264(auVar126);
          auVar203 = ZEXT3264(auVar128);
          lVar114 = lVar114 + 8;
          auVar235 = auVar237;
        } while ((int)lVar114 < iVar14);
      }
      uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar175;
      auVar41._0_4_ = uVar175;
      auVar41._8_4_ = uVar175;
      auVar41._12_4_ = uVar175;
      auVar41._16_4_ = uVar175;
      auVar41._20_4_ = uVar175;
      auVar41._24_4_ = uVar175;
      auVar41._28_4_ = uVar175;
      uVar32 = vcmpps_avx512vl(local_320,auVar41,2);
      uVar112 = (uint)uVar113 & (uint)uVar32;
      uVar113 = (ulong)uVar112;
    } while (uVar112 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }